

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  uint uVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  size_t k;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [28];
  bool bVar73;
  int iVar74;
  ulong uVar75;
  Geometry *pGVar76;
  long lVar77;
  ulong uVar78;
  undefined1 (*pauVar79) [32];
  ulong uVar80;
  long lVar81;
  undefined1 auVar82 [8];
  uint uVar83;
  NodeRef root;
  ulong uVar84;
  long lVar85;
  undefined4 uVar86;
  Geometry *unaff_R13;
  Geometry *pGVar87;
  ulong *puVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar107;
  float fVar108;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar125;
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar123;
  float fVar127;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar124;
  float fVar126;
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar134;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar129;
  float fVar131;
  float fVar133;
  undefined1 auVar122 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar142;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar141 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar158;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [36];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar187 [32];
  undefined1 auVar186 [32];
  undefined1 auVar188 [64];
  float fVar190;
  undefined1 auVar189 [64];
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [32];
  undefined1 auVar199 [32];
  RTCFilterFunctionNArguments args;
  Precalculations pre;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  RTCFilterFunctionNArguments local_2f90;
  undefined1 local_2f60 [32];
  RayK<8> *local_2f30;
  GridSOA *local_2f28;
  GridSOA *local_2f20;
  GridSOA *local_2f18;
  GridSOA *local_2f10;
  GridSOA *local_2f08;
  undefined1 local_2f00 [8];
  undefined1 auStack_2ef8 [8];
  float fStack_2ef0;
  float fStack_2eec;
  float fStack_2ee8;
  undefined1 local_2ee0 [8];
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  undefined4 uStack_2ec4;
  undefined1 local_2ec0 [56];
  undefined1 (*local_2e88) [32];
  GridSOA *local_2e80;
  GridSOA *local_2e78;
  Precalculations local_2e70;
  undefined1 local_2e60 [32];
  undefined1 local_2e40 [32];
  undefined1 local_2e20 [32];
  undefined1 local_2e00 [32];
  BVH *local_2dd0;
  Intersectors *local_2dc8;
  long local_2dc0;
  Geometry *local_2db8;
  long local_2db0;
  GridSOA *local_2da8;
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2d40;
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [8];
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2ca0;
  RTCRayQueryContext local_2c80 [4];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2c60;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2c40;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  uint local_2b80;
  uint uStack_2b7c;
  uint uStack_2b78;
  uint uStack_2b74;
  uint uStack_2b70;
  uint uStack_2b6c;
  uint uStack_2b68;
  uint uStack_2b64;
  uint local_2b60;
  uint uStack_2b5c;
  uint uStack_2b58;
  uint uStack_2b54;
  uint uStack_2b50;
  uint uStack_2b4c;
  uint uStack_2b48;
  uint uStack_2b44;
  uint local_2b40;
  uint uStack_2b3c;
  uint uStack_2b38;
  uint uStack_2b34;
  uint uStack_2b30;
  uint uStack_2b2c;
  uint uStack_2b28;
  uint uStack_2b24;
  undefined1 local_2b20 [32];
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2ac0;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2aa0;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_28a0;
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2740;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined1 local_2700 [8];
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar181 [64];
  
  local_2dd0 = (BVH *)This->ptr;
  local_2608 = (local_2dd0->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar154 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar109 = ZEXT816(0) << 0x40;
      auVar149 = vpcmpeqd_avx2(auVar154,(undefined1  [32])valid_i->field_0);
      auVar154 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar109),5);
      auVar99 = auVar149 & auVar154;
      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0x7f,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar99 >> 0xbf,0) != '\0') ||
          (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar99[0x1f] < '\0') {
        auVar154 = vandps_avx(auVar154,auVar149);
        auVar18 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
        local_2e70.super_Precalculations.grid = (GridSOA *)0x0;
        local_2aa0._0_8_ = *(undefined8 *)ray;
        local_2aa0._8_8_ = *(undefined8 *)(ray + 8);
        local_2aa0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2aa0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2aa0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2aa0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2aa0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2aa0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2aa0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2aa0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2aa0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2aa0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2a40 = *(undefined1 (*) [32])(ray + 0x80);
        local_2a20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2b20._8_4_ = 0x7fffffff;
        local_2b20._0_8_ = 0x7fffffff7fffffff;
        local_2b20._12_4_ = 0x7fffffff;
        local_2b20._16_4_ = 0x7fffffff;
        local_2b20._20_4_ = 0x7fffffff;
        local_2b20._24_4_ = 0x7fffffff;
        local_2b20._28_4_ = 0x7fffffff;
        auVar184._8_4_ = 0x219392ef;
        auVar184._0_8_ = 0x219392ef219392ef;
        auVar184._12_4_ = 0x219392ef;
        auVar184._16_4_ = 0x219392ef;
        auVar184._20_4_ = 0x219392ef;
        auVar184._24_4_ = 0x219392ef;
        auVar184._28_4_ = 0x219392ef;
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = 0x3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar186._16_4_ = 0x3f800000;
        auVar186._20_4_ = 0x3f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        local_2a00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar116 = vdivps_avx(auVar186,local_2a40);
        auVar154 = vandps_avx(local_2b20,local_2a40);
        auVar99 = vcmpps_avx(auVar154,auVar184,1);
        auVar154 = vandps_avx(local_2b20,local_2a20);
        auVar149 = vcmpps_avx(auVar154,auVar184,1);
        auVar171 = ZEXT3264(auVar149);
        auVar115 = vdivps_avx(auVar186,local_2a20);
        auVar154 = vandps_avx(local_2b20,local_2a00);
        auVar178._8_4_ = 0x5d5e0b6b;
        auVar178._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar178._12_4_ = 0x5d5e0b6b;
        auVar178._16_4_ = 0x5d5e0b6b;
        auVar178._20_4_ = 0x5d5e0b6b;
        auVar178._24_4_ = 0x5d5e0b6b;
        auVar178._28_4_ = 0x5d5e0b6b;
        auVar181 = ZEXT3264(auVar178);
        _local_29e0 = vblendvps_avx(auVar116,auVar178,auVar99);
        auVar154 = vcmpps_avx(auVar154,auVar184,1);
        auVar99 = vdivps_avx(auVar186,local_2a00);
        _local_29c0 = vblendvps_avx(auVar115,auVar178,auVar149);
        _local_29a0 = vblendvps_avx(auVar99,auVar178,auVar154);
        auVar154 = vcmpps_avx(_local_29e0,ZEXT1632(auVar109),1);
        auVar115._8_4_ = 0x10;
        auVar115._0_8_ = 0x1000000010;
        auVar115._12_4_ = 0x10;
        auVar115._16_4_ = 0x10;
        auVar115._20_4_ = 0x10;
        auVar115._24_4_ = 0x10;
        auVar115._28_4_ = 0x10;
        local_2980 = vandps_avx(auVar154,auVar115);
        auVar99 = ZEXT1632(auVar109);
        auVar154 = vcmpps_avx(_local_29c0,auVar99,5);
        auVar149._8_4_ = 0x20;
        auVar149._0_8_ = 0x2000000020;
        auVar149._12_4_ = 0x20;
        auVar149._16_4_ = 0x20;
        auVar149._20_4_ = 0x20;
        auVar149._24_4_ = 0x20;
        auVar149._28_4_ = 0x20;
        auVar144._8_4_ = 0x30;
        auVar144._0_8_ = 0x3000000030;
        auVar144._12_4_ = 0x30;
        auVar144._16_4_ = 0x30;
        auVar144._20_4_ = 0x30;
        auVar144._24_4_ = 0x30;
        auVar144._28_4_ = 0x30;
        local_2960 = vblendvps_avx(auVar144,auVar149,auVar154);
        auVar154 = vcmpps_avx(_local_29a0,auVar99,5);
        auVar116._8_4_ = 0x40;
        auVar116._0_8_ = 0x4000000040;
        auVar116._12_4_ = 0x40;
        auVar116._16_4_ = 0x40;
        auVar116._20_4_ = 0x40;
        auVar116._24_4_ = 0x40;
        auVar116._28_4_ = 0x40;
        auVar157._8_4_ = 0x50;
        auVar157._0_8_ = 0x5000000050;
        auVar157._12_4_ = 0x50;
        auVar157._16_4_ = 0x50;
        auVar157._20_4_ = 0x50;
        auVar157._24_4_ = 0x50;
        auVar157._28_4_ = 0x50;
        local_2940 = vblendvps_avx(auVar157,auVar116,auVar154);
        auVar154 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar99);
        local_28c0 = vpmovsxwd_avx2(auVar18);
        auVar98._8_4_ = 0x7f800000;
        auVar98._0_8_ = 0x7f8000007f800000;
        auVar98._12_4_ = 0x7f800000;
        auVar98._16_4_ = 0x7f800000;
        auVar98._20_4_ = 0x7f800000;
        auVar98._24_4_ = 0x7f800000;
        auVar98._28_4_ = 0x7f800000;
        auVar165 = ZEXT3264(auVar98);
        local_2920 = vblendvps_avx(auVar98,auVar154,local_28c0);
        auVar154 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar99);
        auVar99._8_4_ = 0xff800000;
        auVar99._0_8_ = 0xff800000ff800000;
        auVar99._12_4_ = 0xff800000;
        auVar99._16_4_ = 0xff800000;
        auVar99._20_4_ = 0xff800000;
        auVar99._24_4_ = 0xff800000;
        auVar99._28_4_ = 0xff800000;
        local_2900 = vblendvps_avx(auVar99,auVar154,local_28c0);
        auVar109 = vpcmpeqd_avx(local_2900._0_16_,local_2900._0_16_);
        local_2d80 = vpmovsxwd_avx2(auVar18 ^ auVar109);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar83 = 5;
        }
        else {
          uVar83 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2f30 = ray + 0x100;
        puVar88 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar79 = (undefined1 (*) [32])local_1e40;
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        local_1e60 = local_2920;
        local_28e0._16_16_ = mm_lookupmask_ps._0_16_;
        local_28e0._0_16_ = mm_lookupmask_ps._0_16_;
        auVar122 = ZEXT3264(local_28e0);
        local_2e88 = (undefined1 (*) [32])&local_2b60;
        auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        auVar182 = ZEXT3264(local_1e80);
        local_2dc8 = This;
LAB_015ce27d:
        do {
          do {
            root.ptr = puVar88[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_015cfa85;
            puVar88 = puVar88 + -1;
            pauVar79 = pauVar79 + -1;
            local_2e60 = *pauVar79;
            auVar189 = ZEXT3264(local_2e60);
            auVar154 = vcmpps_avx(local_2e60,local_2900,1);
          } while ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar154 >> 0x7f,0) == '\0') &&
                     (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar154 >> 0xbf,0) == '\0') &&
                   (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar154[0x1f]);
          uVar86 = vmovmskps_avx(auVar154);
          unaff_R13 = (Geometry *)CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar86);
          if (uVar83 < (uint)POPCOUNT(uVar86)) {
LAB_015ce2ba:
            do {
              iVar74 = 4;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_015cfa85;
                auVar154 = vcmpps_avx(local_2900,auVar189._0_32_,6);
                if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar154 >> 0x7f,0) != '\0') ||
                      (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar154 >> 0xbf,0) != '\0') ||
                    (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar154[0x1f] < '\0') {
                  if (((uint)root.ptr & 0xf) == 8) {
                    auVar154 = vpcmpeqd_avx2(auVar154,auVar154);
                    auVar141 = ZEXT3264(auVar154 ^ local_2d80);
                    uVar80 = (ulong)*(uint *)(local_2e70.super_Precalculations.grid + 0x14);
                    uVar78 = (ulong)*(uint *)(local_2e70.super_Precalculations.grid + 0xc);
                    uVar75 = (ulong)*(uint *)(local_2e70.super_Precalculations.grid + 0x24);
                    pGVar87 = (Geometry *)
                              ((ulong)(*(int *)(local_2e70.super_Precalculations.grid + 0x10) != 2)
                              + 1);
                    lVar81 = uVar80 * 0xc + uVar75;
                    local_2dc0 = uVar78 * 4;
                    uVar84 = root.ptr >> 4;
                    local_2f20 = local_2e70.super_Precalculations.grid +
                                 uVar84 * 4 + lVar81 + uVar78 * 4 + 0x2c;
                    lVar77 = uVar75 + uVar80 * 8;
                    local_2f08 = local_2e70.super_Precalculations.grid +
                                 uVar84 * 4 + lVar77 + uVar78 * 4 + 0x30;
                    lVar85 = uVar75 + uVar80 * 4;
                    local_2f10 = local_2e70.super_Precalculations.grid +
                                 uVar84 * 4 + lVar85 + uVar78 * 4 + 0x30;
                    local_2f18 = local_2e70.super_Precalculations.grid +
                                 uVar84 * 4 + uVar75 + uVar78 * 4 + 0x30;
                    local_2f28 = local_2e70.super_Precalculations.grid + uVar84 * 4 + lVar81 + 0x30;
                    local_2e78 = local_2e70.super_Precalculations.grid + uVar84 * 4 + lVar77 + 0x30;
                    local_2e80 = local_2e70.super_Precalculations.grid + uVar84 * 4 + lVar85 + 0x30;
                    lVar77 = uVar75 + uVar84 * 4 + 0x2c;
                    pGVar76 = (Geometry *)0x0;
                    auVar82 = (undefined1  [8])local_2e70.super_Precalculations.grid;
                    unaff_R13 = pGVar87;
                    while (pGVar76 != pGVar87) {
                      local_2db8 = (Geometry *)((long)&(pGVar76->super_RefCount)._vptr_RefCount + 1)
                      ;
                      local_2da8 = (GridSOA *)((long)auVar82 + lVar77);
                      local_2f60 = auVar141._0_32_;
                      local_2db0 = lVar77;
                      for (lVar85 = 0; (ulong)(uVar78 != 2) * 4 + 4 != lVar85; lVar85 = lVar85 + 4)
                      {
                        uVar86 = *(undefined4 *)(local_2da8 + lVar85);
                        auVar95._4_4_ = uVar86;
                        auVar95._0_4_ = uVar86;
                        auVar95._8_4_ = uVar86;
                        auVar95._12_4_ = uVar86;
                        auVar95._16_4_ = uVar86;
                        auVar95._20_4_ = uVar86;
                        auVar95._24_4_ = uVar86;
                        auVar95._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2e80 + lVar85 + -4);
                        auVar110._4_4_ = uVar86;
                        auVar110._0_4_ = uVar86;
                        auVar110._8_4_ = uVar86;
                        auVar110._12_4_ = uVar86;
                        auVar110._16_4_ = uVar86;
                        auVar110._20_4_ = uVar86;
                        auVar110._24_4_ = uVar86;
                        auVar110._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2e78 + lVar85 + -4);
                        auVar135._4_4_ = uVar86;
                        auVar135._0_4_ = uVar86;
                        auVar135._8_4_ = uVar86;
                        auVar135._12_4_ = uVar86;
                        auVar135._16_4_ = uVar86;
                        auVar135._20_4_ = uVar86;
                        auVar135._24_4_ = uVar86;
                        auVar135._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2f18 + lVar85 + -4);
                        local_2640._4_4_ = uVar86;
                        local_2640._0_4_ = uVar86;
                        local_2640._8_4_ = uVar86;
                        local_2640._12_4_ = uVar86;
                        local_2640._16_4_ = uVar86;
                        local_2640._20_4_ = uVar86;
                        local_2640._24_4_ = uVar86;
                        local_2640._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2f10 + lVar85 + -4);
                        local_2660._4_4_ = uVar86;
                        local_2660._0_4_ = uVar86;
                        local_2660._8_4_ = uVar86;
                        local_2660._12_4_ = uVar86;
                        local_2660._16_4_ = uVar86;
                        local_2660._20_4_ = uVar86;
                        local_2660._24_4_ = uVar86;
                        local_2660._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2f08 + lVar85 + -4);
                        local_2680._4_4_ = uVar86;
                        local_2680._0_4_ = uVar86;
                        local_2680._8_4_ = uVar86;
                        local_2680._12_4_ = uVar86;
                        local_2680._16_4_ = uVar86;
                        local_2680._20_4_ = uVar86;
                        local_2680._24_4_ = uVar86;
                        local_2680._28_4_ = uVar86;
                        auVar154 = *(undefined1 (*) [32])ray;
                        auVar99 = *(undefined1 (*) [32])(ray + 0x20);
                        auVar149 = *(undefined1 (*) [32])(ray + 0x40);
                        _local_2f00 = vsubps_avx(auVar95,auVar154);
                        local_2ec0._0_32_ = vsubps_avx(auVar110,auVar99);
                        _local_2ee0 = vsubps_avx(auVar135,auVar149);
                        auVar115 = vsubps_avx(local_2660,auVar99);
                        auVar144 = vsubps_avx(local_2680,auVar149);
                        local_2da0 = vsubps_avx(auVar115,local_2ec0._0_32_);
                        auVar157 = vsubps_avx(auVar144,_local_2ee0);
                        auVar143._0_4_ = auVar115._0_4_ + local_2ec0._0_4_;
                        auVar143._4_4_ = auVar115._4_4_ + local_2ec0._4_4_;
                        auVar143._8_4_ = auVar115._8_4_ + local_2ec0._8_4_;
                        auVar143._12_4_ = auVar115._12_4_ + local_2ec0._12_4_;
                        auVar143._16_4_ = auVar115._16_4_ + local_2ec0._16_4_;
                        auVar143._20_4_ = auVar115._20_4_ + local_2ec0._20_4_;
                        auVar143._24_4_ = auVar115._24_4_ + local_2ec0._24_4_;
                        auVar143._28_4_ = auVar115._28_4_ + local_2ec0._28_4_;
                        fVar6 = local_2ee0._0_4_;
                        auVar172._0_4_ = auVar144._0_4_ + fVar6;
                        fVar7 = local_2ee0._4_4_;
                        auVar172._4_4_ = auVar144._4_4_ + fVar7;
                        fVar8 = local_2ee0._8_4_;
                        auVar172._8_4_ = auVar144._8_4_ + fVar8;
                        fVar9 = local_2ee0._12_4_;
                        auVar172._12_4_ = auVar144._12_4_ + fVar9;
                        fVar10 = local_2ee0._16_4_;
                        auVar172._16_4_ = auVar144._16_4_ + fVar10;
                        fVar11 = local_2ee0._20_4_;
                        auVar172._20_4_ = auVar144._20_4_ + fVar11;
                        fVar12 = local_2ee0._24_4_;
                        auVar172._24_4_ = auVar144._24_4_ + fVar12;
                        fVar124 = auVar144._28_4_;
                        auVar172._28_4_ = fVar124 + local_2ee0._28_4_;
                        auVar171._0_4_ = auVar143._0_4_ * auVar157._0_4_;
                        auVar171._4_4_ = auVar143._4_4_ * auVar157._4_4_;
                        auVar171._8_4_ = auVar143._8_4_ * auVar157._8_4_;
                        auVar171._12_4_ = auVar143._12_4_ * auVar157._12_4_;
                        auVar171._16_4_ = auVar143._16_4_ * auVar157._16_4_;
                        auVar171._20_4_ = auVar143._20_4_ * auVar157._20_4_;
                        auVar171._28_36_ = auVar189._28_36_;
                        auVar171._24_4_ = auVar143._24_4_ * auVar157._24_4_;
                        auVar18 = vfmsub231ps_fma(auVar171._0_32_,local_2da0,auVar172);
                        auVar98 = vsubps_avx(local_2640,auVar154);
                        local_2d60 = vsubps_avx(auVar98,_local_2f00);
                        auVar165._0_4_ = auVar172._0_4_ * local_2d60._0_4_;
                        auVar165._4_4_ = auVar172._4_4_ * local_2d60._4_4_;
                        auVar165._8_4_ = auVar172._8_4_ * local_2d60._8_4_;
                        auVar165._12_4_ = auVar172._12_4_ * local_2d60._12_4_;
                        auVar165._16_4_ = auVar172._16_4_ * local_2d60._16_4_;
                        auVar165._20_4_ = auVar172._20_4_ * local_2d60._20_4_;
                        auVar165._28_36_ = auVar182._28_36_;
                        auVar165._24_4_ = auVar172._24_4_ * local_2d60._24_4_;
                        auVar173._0_4_ = auVar98._0_4_ + local_2f00._0_4_;
                        auVar173._4_4_ = auVar98._4_4_ + local_2f00._4_4_;
                        auVar173._8_4_ = auVar98._8_4_ + local_2f00._8_4_;
                        auVar173._12_4_ = auVar98._12_4_ + local_2f00._12_4_;
                        auVar173._16_4_ = auVar98._16_4_ + local_2f00._16_4_;
                        auVar173._20_4_ = auVar98._20_4_ + local_2f00._20_4_;
                        auVar173._24_4_ = auVar98._24_4_ + local_2f00._24_4_;
                        auVar173._28_4_ = auVar98._28_4_ + local_2f00._28_4_;
                        auVar109 = vfmsub231ps_fma(auVar165._0_32_,auVar157,auVar173);
                        auVar22._4_4_ = auVar173._4_4_ * local_2da0._4_4_;
                        auVar22._0_4_ = auVar173._0_4_ * local_2da0._0_4_;
                        auVar22._8_4_ = auVar173._8_4_ * local_2da0._8_4_;
                        auVar22._12_4_ = auVar173._12_4_ * local_2da0._12_4_;
                        auVar22._16_4_ = auVar173._16_4_ * local_2da0._16_4_;
                        auVar22._20_4_ = auVar173._20_4_ * local_2da0._20_4_;
                        auVar22._24_4_ = auVar173._24_4_ * local_2da0._24_4_;
                        auVar22._28_4_ = auVar173._28_4_;
                        auVar155 = vfmsub231ps_fma(auVar22,local_2d60,auVar143);
                        pRVar1 = ray + 0xc0;
                        fVar123 = *(float *)pRVar1;
                        fVar125 = *(float *)(ray + 0xc4);
                        fVar127 = *(float *)(ray + 200);
                        fVar129 = *(float *)(ray + 0xcc);
                        fVar131 = *(float *)(ray + 0xd0);
                        fVar133 = *(float *)(ray + 0xd4);
                        fVar108 = *(float *)(ray + 0xd8);
                        auVar72 = *(undefined1 (*) [28])pRVar1;
                        auVar186 = *(undefined1 (*) [32])pRVar1;
                        auVar23._4_4_ = auVar155._4_4_ * fVar125;
                        auVar23._0_4_ = auVar155._0_4_ * fVar123;
                        auVar23._8_4_ = auVar155._8_4_ * fVar127;
                        auVar23._12_4_ = auVar155._12_4_ * fVar129;
                        auVar23._16_4_ = fVar131 * 0.0;
                        auVar23._20_4_ = fVar133 * 0.0;
                        auVar23._24_4_ = fVar108 * 0.0;
                        auVar23._28_4_ = auVar143._28_4_;
                        local_2e20 = *(undefined1 (*) [32])(ray + 0xa0);
                        auVar109 = vfmadd231ps_fma(auVar23,local_2e20,ZEXT1632(auVar109));
                        auVar116 = *(undefined1 (*) [32])(ray + 0x80);
                        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar116,ZEXT1632(auVar18));
                        uVar86 = *(undefined4 *)(local_2da8 + lVar85 + 4);
                        local_26a0._4_4_ = uVar86;
                        local_26a0._0_4_ = uVar86;
                        local_26a0._8_4_ = uVar86;
                        local_26a0._12_4_ = uVar86;
                        local_26a0._16_4_ = uVar86;
                        local_26a0._20_4_ = uVar86;
                        local_26a0._24_4_ = uVar86;
                        local_26a0._28_4_ = uVar86;
                        auVar154 = vsubps_avx(local_26a0,auVar154);
                        uVar86 = *(undefined4 *)(local_2e80 + lVar85);
                        local_26c0._4_4_ = uVar86;
                        local_26c0._0_4_ = uVar86;
                        local_26c0._8_4_ = uVar86;
                        local_26c0._12_4_ = uVar86;
                        local_26c0._16_4_ = uVar86;
                        local_26c0._20_4_ = uVar86;
                        local_26c0._24_4_ = uVar86;
                        local_26c0._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2e78 + lVar85);
                        local_26e0._4_4_ = uVar86;
                        local_26e0._0_4_ = uVar86;
                        local_26e0._8_4_ = uVar86;
                        local_26e0._12_4_ = uVar86;
                        local_26e0._16_4_ = uVar86;
                        local_26e0._20_4_ = uVar86;
                        local_26e0._24_4_ = uVar86;
                        local_26e0._28_4_ = uVar86;
                        auVar99 = vsubps_avx(local_26c0,auVar99);
                        auVar149 = vsubps_avx(local_26e0,auVar149);
                        local_2ce0 = vsubps_avx(local_2ec0._0_32_,auVar99);
                        auVar178 = vsubps_avx(_local_2ee0,auVar149);
                        auVar169._0_4_ = local_2ec0._0_4_ + auVar99._0_4_;
                        auVar169._4_4_ = local_2ec0._4_4_ + auVar99._4_4_;
                        auVar169._8_4_ = local_2ec0._8_4_ + auVar99._8_4_;
                        auVar169._12_4_ = local_2ec0._12_4_ + auVar99._12_4_;
                        auVar169._16_4_ = local_2ec0._16_4_ + auVar99._16_4_;
                        auVar169._20_4_ = local_2ec0._20_4_ + auVar99._20_4_;
                        auVar169._24_4_ = local_2ec0._24_4_ + auVar99._24_4_;
                        auVar169._28_4_ = local_2ec0._28_4_ + auVar99._28_4_;
                        auVar187._0_4_ = fVar6 + auVar149._0_4_;
                        auVar187._4_4_ = fVar7 + auVar149._4_4_;
                        auVar187._8_4_ = fVar8 + auVar149._8_4_;
                        auVar187._12_4_ = fVar9 + auVar149._12_4_;
                        auVar187._16_4_ = fVar10 + auVar149._16_4_;
                        auVar187._20_4_ = fVar11 + auVar149._20_4_;
                        auVar187._24_4_ = fVar12 + auVar149._24_4_;
                        fVar107 = auVar149._28_4_;
                        auVar187._28_4_ = local_2ee0._28_4_ + fVar107;
                        fVar191 = auVar178._0_4_;
                        fVar193 = auVar178._4_4_;
                        auVar24._4_4_ = fVar193 * auVar169._4_4_;
                        auVar24._0_4_ = fVar191 * auVar169._0_4_;
                        fVar194 = auVar178._8_4_;
                        auVar24._8_4_ = fVar194 * auVar169._8_4_;
                        fVar195 = auVar178._12_4_;
                        auVar24._12_4_ = fVar195 * auVar169._12_4_;
                        fVar196 = auVar178._16_4_;
                        auVar24._16_4_ = fVar196 * auVar169._16_4_;
                        fVar197 = auVar178._20_4_;
                        auVar24._20_4_ = fVar197 * auVar169._20_4_;
                        fVar198 = auVar178._24_4_;
                        auVar24._24_4_ = fVar198 * auVar169._24_4_;
                        auVar24._28_4_ = fVar124;
                        auVar155 = vfmsub231ps_fma(auVar24,local_2ce0,auVar187);
                        local_2d00 = vsubps_avx(_local_2f00,auVar154);
                        fVar104 = local_2d00._0_4_;
                        fVar105 = local_2d00._4_4_;
                        auVar25._4_4_ = auVar187._4_4_ * fVar105;
                        auVar25._0_4_ = auVar187._0_4_ * fVar104;
                        fVar106 = local_2d00._8_4_;
                        auVar25._8_4_ = auVar187._8_4_ * fVar106;
                        fVar14 = local_2d00._12_4_;
                        auVar25._12_4_ = auVar187._12_4_ * fVar14;
                        fVar15 = local_2d00._16_4_;
                        auVar25._16_4_ = auVar187._16_4_ * fVar15;
                        fVar16 = local_2d00._20_4_;
                        auVar25._20_4_ = auVar187._20_4_ * fVar16;
                        fVar17 = local_2d00._24_4_;
                        auVar25._24_4_ = auVar187._24_4_ * fVar17;
                        auVar25._28_4_ = auVar187._28_4_;
                        auVar166._0_4_ = local_2f00._0_4_ + auVar154._0_4_;
                        auVar166._4_4_ = local_2f00._4_4_ + auVar154._4_4_;
                        auVar166._8_4_ = local_2f00._8_4_ + auVar154._8_4_;
                        auVar166._12_4_ = local_2f00._12_4_ + auVar154._12_4_;
                        auVar166._16_4_ = local_2f00._16_4_ + auVar154._16_4_;
                        auVar166._20_4_ = local_2f00._20_4_ + auVar154._20_4_;
                        auVar166._24_4_ = local_2f00._24_4_ + auVar154._24_4_;
                        auVar166._28_4_ = local_2f00._28_4_ + auVar154._28_4_;
                        auVar18 = vfmsub231ps_fma(auVar25,auVar178,auVar166);
                        fVar126 = local_2ce0._0_4_;
                        fVar128 = local_2ce0._4_4_;
                        auVar26._4_4_ = fVar128 * auVar166._4_4_;
                        auVar26._0_4_ = fVar126 * auVar166._0_4_;
                        fVar130 = local_2ce0._8_4_;
                        auVar26._8_4_ = fVar130 * auVar166._8_4_;
                        fVar132 = local_2ce0._12_4_;
                        auVar26._12_4_ = fVar132 * auVar166._12_4_;
                        fVar134 = local_2ce0._16_4_;
                        auVar26._16_4_ = fVar134 * auVar166._16_4_;
                        fVar142 = local_2ce0._20_4_;
                        auVar26._20_4_ = fVar142 * auVar166._20_4_;
                        fVar190 = local_2ce0._24_4_;
                        auVar26._24_4_ = fVar190 * auVar166._24_4_;
                        auVar26._28_4_ = auVar166._28_4_;
                        auVar156 = vfmsub231ps_fma(auVar26,local_2d00,auVar169);
                        auVar27._4_4_ = fVar125 * auVar156._4_4_;
                        auVar27._0_4_ = fVar123 * auVar156._0_4_;
                        auVar27._8_4_ = fVar127 * auVar156._8_4_;
                        auVar27._12_4_ = fVar129 * auVar156._12_4_;
                        auVar27._16_4_ = fVar131 * 0.0;
                        auVar27._20_4_ = fVar133 * 0.0;
                        auVar27._24_4_ = fVar108 * 0.0;
                        auVar27._28_4_ = auVar169._28_4_;
                        auVar18 = vfmadd231ps_fma(auVar27,local_2e20,ZEXT1632(auVar18));
                        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar116,ZEXT1632(auVar155));
                        auVar171 = ZEXT1664(auVar18);
                        auVar184 = vsubps_avx(auVar154,auVar98);
                        auVar96._0_4_ = auVar98._0_4_ + auVar154._0_4_;
                        auVar96._4_4_ = auVar98._4_4_ + auVar154._4_4_;
                        auVar96._8_4_ = auVar98._8_4_ + auVar154._8_4_;
                        auVar96._12_4_ = auVar98._12_4_ + auVar154._12_4_;
                        auVar96._16_4_ = auVar98._16_4_ + auVar154._16_4_;
                        auVar96._20_4_ = auVar98._20_4_ + auVar154._20_4_;
                        auVar96._24_4_ = auVar98._24_4_ + auVar154._24_4_;
                        auVar96._28_4_ = auVar98._28_4_ + auVar154._28_4_;
                        auVar98 = vsubps_avx(auVar99,auVar115);
                        auVar111._0_4_ = auVar115._0_4_ + auVar99._0_4_;
                        auVar111._4_4_ = auVar115._4_4_ + auVar99._4_4_;
                        auVar111._8_4_ = auVar115._8_4_ + auVar99._8_4_;
                        auVar111._12_4_ = auVar115._12_4_ + auVar99._12_4_;
                        auVar111._16_4_ = auVar115._16_4_ + auVar99._16_4_;
                        auVar111._20_4_ = auVar115._20_4_ + auVar99._20_4_;
                        auVar111._24_4_ = auVar115._24_4_ + auVar99._24_4_;
                        auVar111._28_4_ = auVar115._28_4_ + auVar99._28_4_;
                        auVar179 = vsubps_avx(auVar149,auVar144);
                        auVar136._0_4_ = auVar149._0_4_ + auVar144._0_4_;
                        auVar136._4_4_ = auVar149._4_4_ + auVar144._4_4_;
                        auVar136._8_4_ = auVar149._8_4_ + auVar144._8_4_;
                        auVar136._12_4_ = auVar149._12_4_ + auVar144._12_4_;
                        auVar136._16_4_ = auVar149._16_4_ + auVar144._16_4_;
                        auVar136._20_4_ = auVar149._20_4_ + auVar144._20_4_;
                        auVar136._24_4_ = auVar149._24_4_ + auVar144._24_4_;
                        auVar136._28_4_ = fVar107 + fVar124;
                        auVar28._4_4_ = auVar179._4_4_ * auVar111._4_4_;
                        auVar28._0_4_ = auVar179._0_4_ * auVar111._0_4_;
                        auVar28._8_4_ = auVar179._8_4_ * auVar111._8_4_;
                        auVar28._12_4_ = auVar179._12_4_ * auVar111._12_4_;
                        auVar28._16_4_ = auVar179._16_4_ * auVar111._16_4_;
                        auVar28._20_4_ = auVar179._20_4_ * auVar111._20_4_;
                        auVar28._24_4_ = auVar179._24_4_ * auVar111._24_4_;
                        auVar28._28_4_ = fVar107;
                        auVar156 = vfmsub231ps_fma(auVar28,auVar98,auVar136);
                        auVar29._4_4_ = auVar184._4_4_ * auVar136._4_4_;
                        auVar29._0_4_ = auVar184._0_4_ * auVar136._0_4_;
                        auVar29._8_4_ = auVar184._8_4_ * auVar136._8_4_;
                        auVar29._12_4_ = auVar184._12_4_ * auVar136._12_4_;
                        auVar29._16_4_ = auVar184._16_4_ * auVar136._16_4_;
                        auVar29._20_4_ = auVar184._20_4_ * auVar136._20_4_;
                        auVar29._24_4_ = auVar184._24_4_ * auVar136._24_4_;
                        auVar29._28_4_ = auVar136._28_4_;
                        auVar155 = vfmsub231ps_fma(auVar29,auVar179,auVar96);
                        auVar30._4_4_ = auVar98._4_4_ * auVar96._4_4_;
                        auVar30._0_4_ = auVar98._0_4_ * auVar96._0_4_;
                        auVar30._8_4_ = auVar98._8_4_ * auVar96._8_4_;
                        auVar30._12_4_ = auVar98._12_4_ * auVar96._12_4_;
                        auVar30._16_4_ = auVar98._16_4_ * auVar96._16_4_;
                        auVar30._20_4_ = auVar98._20_4_ * auVar96._20_4_;
                        auVar30._24_4_ = auVar98._24_4_ * auVar96._24_4_;
                        auVar30._28_4_ = auVar96._28_4_;
                        auVar19 = vfmsub231ps_fma(auVar30,auVar184,auVar111);
                        auVar97._0_4_ = fVar123 * auVar19._0_4_;
                        auVar97._4_4_ = fVar125 * auVar19._4_4_;
                        auVar97._8_4_ = fVar127 * auVar19._8_4_;
                        auVar97._12_4_ = fVar129 * auVar19._12_4_;
                        auVar97._16_4_ = fVar131 * 0.0;
                        auVar97._20_4_ = fVar133 * 0.0;
                        auVar97._24_4_ = fVar108 * 0.0;
                        auVar97._28_4_ = 0;
                        auVar155 = vfmadd231ps_fma(auVar97,local_2e20,ZEXT1632(auVar155));
                        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar116,ZEXT1632(auVar156));
                        aVar158 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                  ZEXT1632(CONCAT412(auVar155._12_4_ +
                                                     auVar109._12_4_ + auVar18._12_4_,
                                                     CONCAT48(auVar155._8_4_ +
                                                              auVar109._8_4_ + auVar18._8_4_,
                                                              CONCAT44(auVar155._4_4_ +
                                                                       auVar109._4_4_ +
                                                                       auVar18._4_4_,
                                                                       auVar155._0_4_ +
                                                                       auVar109._0_4_ +
                                                                       auVar18._0_4_))));
                        auVar183 = ZEXT436(local_2b20._28_4_);
                        auVar154 = vandps_avx(local_2b20,(undefined1  [32])aVar158);
                        fVar107 = auVar154._0_4_ * 1.1920929e-07;
                        fVar123 = auVar154._4_4_ * 1.1920929e-07;
                        auVar31._4_4_ = fVar123;
                        auVar31._0_4_ = fVar107;
                        fVar125 = auVar154._8_4_ * 1.1920929e-07;
                        auVar31._8_4_ = fVar125;
                        fVar127 = auVar154._12_4_ * 1.1920929e-07;
                        auVar31._12_4_ = fVar127;
                        fVar129 = auVar154._16_4_ * 1.1920929e-07;
                        auVar31._16_4_ = fVar129;
                        fVar131 = auVar154._20_4_ * 1.1920929e-07;
                        auVar31._20_4_ = fVar131;
                        fVar133 = auVar154._24_4_ * 1.1920929e-07;
                        auVar31._24_4_ = fVar133;
                        auVar31._28_4_ = auVar154._28_4_;
                        auVar144 = ZEXT1632(auVar109);
                        auVar99 = vminps_avx(auVar144,ZEXT1632(auVar18));
                        auVar99 = vminps_avx(auVar99,ZEXT1632(auVar155));
                        auVar150._0_8_ = CONCAT44(fVar123,fVar107) ^ 0x8000000080000000;
                        auVar150._8_4_ = -fVar125;
                        auVar150._12_4_ = -fVar127;
                        auVar150._16_4_ = -fVar129;
                        auVar150._20_4_ = -fVar131;
                        auVar150._24_4_ = -fVar133;
                        auVar150._28_4_ = auVar154._28_4_ ^ 0x80000000;
                        auVar154 = vcmpps_avx(auVar99,auVar150,5);
                        auVar149 = vmaxps_avx(auVar144,ZEXT1632(auVar18));
                        auVar99 = vmaxps_avx(auVar149,ZEXT1632(auVar155));
                        auVar99 = vcmpps_avx(auVar99,auVar31,2);
                        auVar154 = vorps_avx(auVar154,auVar99);
                        auVar115 = local_2f60 & auVar154;
                        auVar154 = vandps_avx(auVar154,local_2f60);
                        local_2e60._8_4_ = 0x80000000;
                        local_2e60._0_8_ = 0x8000000080000000;
                        local_2e60._12_4_ = 0x80000000;
                        local_2e60._16_4_ = 0x80000000;
                        local_2e60._20_4_ = 0x80000000;
                        local_2e60._24_4_ = 0x80000000;
                        local_2e60._28_4_ = 0x80000000;
                        auVar99 = auVar154;
                        aVar13 = aVar158;
                        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar115 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar115 >> 0x7f,0) != '\0')
                              || (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar115 >> 0xbf,0) != '\0') ||
                            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar115[0x1f] < '\0') {
                          auVar32._4_4_ = fVar128 * auVar157._4_4_;
                          auVar32._0_4_ = fVar126 * auVar157._0_4_;
                          auVar32._8_4_ = fVar130 * auVar157._8_4_;
                          auVar32._12_4_ = fVar132 * auVar157._12_4_;
                          auVar32._16_4_ = fVar134 * auVar157._16_4_;
                          auVar32._20_4_ = fVar142 * auVar157._20_4_;
                          auVar32._24_4_ = fVar190 * auVar157._24_4_;
                          auVar32._28_4_ = auVar154._28_4_;
                          auVar145._0_4_ = fVar104 * local_2da0._0_4_;
                          auVar145._4_4_ = fVar105 * local_2da0._4_4_;
                          auVar145._8_4_ = fVar106 * local_2da0._8_4_;
                          auVar145._12_4_ = fVar14 * local_2da0._12_4_;
                          auVar145._16_4_ = fVar15 * local_2da0._16_4_;
                          auVar145._20_4_ = fVar16 * local_2da0._20_4_;
                          auVar145._24_4_ = fVar17 * local_2da0._24_4_;
                          auVar145._28_4_ = 0;
                          auVar109 = vfmsub213ps_fma(local_2da0,auVar178,auVar32);
                          auVar33._4_4_ = auVar98._4_4_ * fVar193;
                          auVar33._0_4_ = auVar98._0_4_ * fVar191;
                          auVar33._8_4_ = auVar98._8_4_ * fVar194;
                          auVar33._12_4_ = auVar98._12_4_ * fVar195;
                          auVar33._16_4_ = auVar98._16_4_ * fVar196;
                          auVar33._20_4_ = auVar98._20_4_ * fVar197;
                          auVar33._24_4_ = auVar98._24_4_ * fVar198;
                          auVar33._28_4_ = local_2f60._28_4_;
                          auVar34._4_4_ = auVar179._4_4_ * fVar105;
                          auVar34._0_4_ = auVar179._0_4_ * fVar104;
                          auVar34._8_4_ = auVar179._8_4_ * fVar106;
                          auVar34._12_4_ = auVar179._12_4_ * fVar14;
                          auVar34._16_4_ = auVar179._16_4_ * fVar15;
                          auVar34._20_4_ = auVar179._20_4_ * fVar16;
                          auVar34._24_4_ = auVar179._24_4_ * fVar17;
                          auVar34._28_4_ = auVar149._28_4_;
                          auVar155 = vfmsub213ps_fma(auVar179,local_2ce0,auVar33);
                          auVar99 = vandps_avx(local_2b20,auVar32);
                          auVar149 = vandps_avx(local_2b20,auVar33);
                          auVar99 = vcmpps_avx(auVar99,auVar149,1);
                          auVar115 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar109),auVar99);
                          auVar35._4_4_ = auVar184._4_4_ * fVar128;
                          auVar35._0_4_ = auVar184._0_4_ * fVar126;
                          auVar35._8_4_ = auVar184._8_4_ * fVar130;
                          auVar35._12_4_ = auVar184._12_4_ * fVar132;
                          auVar35._16_4_ = auVar184._16_4_ * fVar134;
                          auVar35._20_4_ = auVar184._20_4_ * fVar142;
                          auVar35._24_4_ = auVar184._24_4_ * fVar190;
                          auVar35._28_4_ = auVar99._28_4_;
                          auVar109 = vfmsub213ps_fma(auVar184,auVar178,auVar34);
                          auVar159._0_4_ = local_2d60._0_4_ * fVar191;
                          auVar159._4_4_ = local_2d60._4_4_ * fVar193;
                          auVar159._8_4_ = local_2d60._8_4_ * fVar194;
                          auVar159._12_4_ = local_2d60._12_4_ * fVar195;
                          auVar159._16_4_ = local_2d60._16_4_ * fVar196;
                          auVar159._20_4_ = local_2d60._20_4_ * fVar197;
                          auVar159._24_4_ = local_2d60._24_4_ * fVar198;
                          auVar159._28_4_ = 0;
                          auVar155 = vfmsub213ps_fma(auVar157,local_2d00,auVar159);
                          auVar99 = vandps_avx(local_2b20,auVar159);
                          auVar149 = vandps_avx(local_2b20,auVar34);
                          auVar99 = vcmpps_avx(auVar99,auVar149,1);
                          auVar178 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar155),auVar99);
                          auVar109 = vfmsub213ps_fma(local_2d60,local_2ce0,auVar145);
                          auVar155 = vfmsub213ps_fma(auVar98,local_2d00,auVar35);
                          auVar99 = vandps_avx(local_2b20,auVar145);
                          auVar149 = vandps_avx(local_2b20,auVar35);
                          auVar99 = vcmpps_avx(auVar99,auVar149,1);
                          aVar13 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                   vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar109),auVar99);
                          local_2cc0._0_4_ = auVar72._0_4_;
                          local_2cc0._4_4_ = auVar72._4_4_;
                          fStack_2cb8 = auVar72._8_4_;
                          fStack_2cb4 = auVar72._12_4_;
                          fStack_2cb0 = auVar72._16_4_;
                          fStack_2cac = auVar72._20_4_;
                          fStack_2ca8 = auVar72._24_4_;
                          auVar36._4_4_ = aVar13.v[1] * (float)local_2cc0._4_4_;
                          auVar36._0_4_ = aVar13.v[0] * (float)local_2cc0._0_4_;
                          auVar36._8_4_ = aVar13.v[2] * fStack_2cb8;
                          auVar36._12_4_ = aVar13.v[3] * fStack_2cb4;
                          auVar36._16_4_ = aVar13.v[4] * fStack_2cb0;
                          auVar36._20_4_ = aVar13.v[5] * fStack_2cac;
                          auVar36._24_4_ = aVar13.v[6] * fStack_2ca8;
                          auVar36._28_4_ = auVar99._28_4_;
                          auVar109 = vfmadd213ps_fma(local_2e20,auVar178,auVar36);
                          auVar109 = vfmadd213ps_fma(auVar116,auVar115,ZEXT1632(auVar109));
                          fVar107 = auVar109._0_4_ + auVar109._0_4_;
                          fVar104 = auVar109._4_4_ + auVar109._4_4_;
                          fVar105 = auVar109._8_4_ + auVar109._8_4_;
                          fVar106 = auVar109._12_4_ + auVar109._12_4_;
                          auVar98 = ZEXT1632(CONCAT412(fVar106,CONCAT48(fVar105,CONCAT44(fVar104,
                                                  fVar107))));
                          auVar112._0_4_ = aVar13.v[0] * fVar6;
                          auVar112._4_4_ = aVar13.v[1] * fVar7;
                          auVar112._8_4_ = aVar13.v[2] * fVar8;
                          auVar112._12_4_ = aVar13.v[3] * fVar9;
                          auVar112._16_4_ = aVar13.v[4] * fVar10;
                          auVar112._20_4_ = aVar13.v[5] * fVar11;
                          auVar112._24_4_ = aVar13.v[6] * fVar12;
                          auVar112._28_4_ = 0;
                          auVar109 = vfmadd213ps_fma(local_2ec0._0_32_,auVar178,auVar112);
                          auVar155 = vfmadd213ps_fma(_local_2f00,auVar115,ZEXT1632(auVar109));
                          auVar99 = vrcpps_avx(auVar98);
                          auVar179._8_4_ = 0x3f800000;
                          auVar179._0_8_ = 0x3f8000003f800000;
                          auVar179._12_4_ = 0x3f800000;
                          auVar179._16_4_ = 0x3f800000;
                          auVar179._20_4_ = 0x3f800000;
                          auVar179._24_4_ = 0x3f800000;
                          auVar179._28_4_ = 0x3f800000;
                          auVar109 = vfnmadd213ps_fma(auVar99,auVar98,auVar179);
                          auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar99,auVar99);
                          auVar116 = ZEXT1632(CONCAT412(auVar109._12_4_ *
                                                        (auVar155._12_4_ + auVar155._12_4_),
                                                        CONCAT48(auVar109._8_4_ *
                                                                 (auVar155._8_4_ + auVar155._8_4_),
                                                                 CONCAT44(auVar109._4_4_ *
                                                                          (auVar155._4_4_ +
                                                                          auVar155._4_4_),
                                                                          auVar109._0_4_ *
                                                                          (auVar155._0_4_ +
                                                                          auVar155._0_4_)))));
                          auVar99 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar116,2);
                          auVar149 = vcmpps_avx(auVar116,*(undefined1 (*) [32])(ray + 0x100),2);
                          auVar99 = vandps_avx(auVar149,auVar99);
                          auVar174._0_8_ = CONCAT44(fVar104,fVar107) ^ 0x8000000080000000;
                          auVar174._8_4_ = -fVar105;
                          auVar174._12_4_ = -fVar106;
                          auVar174._16_4_ = 0x80000000;
                          auVar174._20_4_ = 0x80000000;
                          auVar174._24_4_ = 0x80000000;
                          auVar174._28_4_ = 0x80000000;
                          auVar149 = vcmpps_avx(auVar174,auVar98,4);
                          auVar99 = vandps_avx(auVar149,auVar99);
                          auVar99 = vpslld_avx2(auVar99,0x1f);
                          auVar99 = vpsrad_avx2(auVar99,0x1f);
                          auVar149 = auVar154 & auVar99;
                          auVar99 = vandps_avx(auVar99,auVar154);
                          local_2d40 = aVar158;
                          local_2d20 = auVar154;
                          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar149 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar149 >> 0x7f,0) != '\0') ||
                                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar149 >> 0xbf,0) != '\0') ||
                              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar149[0x1f] < '\0') {
                            local_27c0 = aVar13;
                            local_27a0 = auVar178;
                            local_2780 = auVar115;
                            local_2760 = auVar116;
                            local_2740 = aVar158;
                            _local_2720 = ZEXT1632(auVar18);
                            _local_2700 = auVar144;
                          }
                        }
                        auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                                      CONCAT424(0x3f800003,
                                                                CONCAT420(0x3f800003,
                                                                          CONCAT416(0x3f800003,
                                                                                    CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                        auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                      CONCAT424(0x3f7ffffa,
                                                                CONCAT420(0x3f7ffffa,
                                                                          CONCAT416(0x3f7ffffa,
                                                                                    CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                        auVar181 = ZEXT3264(auVar179);
                        auVar165 = ZEXT3264((undefined1  [32])aVar13);
                        uVar86 = *(undefined4 *)(local_2f18 + lVar85);
                        auVar192._4_4_ = uVar86;
                        auVar192._0_4_ = uVar86;
                        auVar192._8_4_ = uVar86;
                        auVar192._12_4_ = uVar86;
                        auVar192._16_4_ = uVar86;
                        auVar192._20_4_ = uVar86;
                        auVar192._24_4_ = uVar86;
                        auVar192._28_4_ = uVar86;
                        uVar86 = *(undefined4 *)(local_2f10 + lVar85);
                        local_2e40._4_4_ = uVar86;
                        local_2e40._0_4_ = uVar86;
                        local_2e40._8_4_ = uVar86;
                        local_2e40._12_4_ = uVar86;
                        local_2e40._16_4_ = uVar86;
                        local_2e40._20_4_ = uVar86;
                        local_2e40._24_4_ = uVar86;
                        local_2e40._28_4_ = uVar86;
                        auVar189 = ZEXT3264(local_2e40);
                        uVar86 = *(undefined4 *)(local_2f08 + lVar85);
                        auVar175._4_4_ = uVar86;
                        auVar175._0_4_ = uVar86;
                        auVar175._8_4_ = uVar86;
                        auVar175._12_4_ = uVar86;
                        auVar175._16_4_ = uVar86;
                        auVar175._20_4_ = uVar86;
                        auVar175._24_4_ = uVar86;
                        auVar175._28_4_ = uVar86;
                        uVar3 = *(uint *)(local_2e70.super_Precalculations.grid + 0x18);
                        unaff_R13 = (context->scene->geometries).items[uVar3].ptr;
                        uVar2 = unaff_R13->mask;
                        auVar113._4_4_ = uVar2;
                        auVar113._0_4_ = uVar2;
                        auVar113._8_4_ = uVar2;
                        auVar113._12_4_ = uVar2;
                        auVar113._16_4_ = uVar2;
                        auVar113._20_4_ = uVar2;
                        auVar113._24_4_ = uVar2;
                        auVar113._28_4_ = uVar2;
                        auVar154 = vpand_avx2(auVar113,*(undefined1 (*) [32])(ray + 0x120));
                        auVar116 = vpcmpeqd_avx2(auVar154,_DAT_01f7b000);
                        auVar122 = ZEXT3264(auVar116);
                        auVar149 = auVar99 & ~auVar116;
                        auVar154 = local_2f60;
                        _local_2cc0 = auVar186;
                        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar149 >> 0x7f,0) != '\0')
                              || (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar149 >> 0xbf,0) != '\0') ||
                            (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar149[0x1f] < '\0') {
                          auVar154 = vandnps_avx(auVar116,auVar99);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (auVar183 = ZEXT436(local_2b20._28_4_),
                             unaff_R13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_2ec0._0_8_ = pGVar87;
                            local_2f00 = auVar82;
                            auVar149 = vrcpps_avx((undefined1  [32])local_2740);
                            auVar99 = vandps_avx(local_2b20,(undefined1  [32])local_2740);
                            auVar163._8_4_ = 0x3f800000;
                            auVar163._0_8_ = 0x3f8000003f800000;
                            auVar163._12_4_ = 0x3f800000;
                            auVar163._16_4_ = 0x3f800000;
                            auVar163._20_4_ = 0x3f800000;
                            auVar163._24_4_ = 0x3f800000;
                            auVar163._28_4_ = 0x3f800000;
                            auVar109 = vfnmadd213ps_fma(auVar149,(undefined1  [32])local_2740,
                                                        auVar163);
                            auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar149,auVar149);
                            auVar102._8_4_ = 0x219392ef;
                            auVar102._0_8_ = 0x219392ef219392ef;
                            auVar102._12_4_ = 0x219392ef;
                            auVar102._16_4_ = 0x219392ef;
                            auVar102._20_4_ = 0x219392ef;
                            auVar102._24_4_ = 0x219392ef;
                            auVar102._28_4_ = 0x219392ef;
                            auVar149 = vcmpps_avx(auVar99,auVar102,5);
                            auVar99 = vandps_avx(auVar149,ZEXT1632(auVar109));
                            auVar53._4_4_ = auVar99._4_4_ * (float)local_2700._4_4_;
                            auVar53._0_4_ = auVar99._0_4_ * (float)local_2700._0_4_;
                            auVar53._8_4_ = auVar99._8_4_ * fStack_26f8;
                            auVar53._12_4_ = auVar99._12_4_ * fStack_26f4;
                            auVar53._16_4_ = auVar99._16_4_ * fStack_26f0;
                            auVar53._20_4_ = auVar99._20_4_ * fStack_26ec;
                            auVar53._24_4_ = auVar99._24_4_ * fStack_26e8;
                            auVar53._28_4_ = auVar149._28_4_;
                            auVar116 = vminps_avx(auVar53,auVar163);
                            auVar54._4_4_ = auVar99._4_4_ * (float)local_2720._4_4_;
                            auVar54._0_4_ = auVar99._0_4_ * (float)local_2720._0_4_;
                            auVar54._8_4_ = auVar99._8_4_ * fStack_2718;
                            auVar54._12_4_ = auVar99._12_4_ * fStack_2714;
                            auVar54._16_4_ = auVar99._16_4_ * fStack_2710;
                            auVar54._20_4_ = auVar99._20_4_ * fStack_270c;
                            auVar54._24_4_ = auVar99._24_4_ * fStack_2708;
                            auVar54._28_4_ = auVar99._28_4_;
                            auVar115 = vminps_avx(auVar54,auVar163);
                            local_2e20._0_4_ =
                                 *(undefined4 *)(local_2e70.super_Precalculations.grid + 0x1c);
                            uVar86 = *(undefined4 *)(local_2f28 + lVar85 + -4);
                            auVar138._4_4_ = uVar86;
                            auVar138._0_4_ = uVar86;
                            auVar138._8_4_ = uVar86;
                            auVar138._12_4_ = uVar86;
                            auVar138._16_4_ = uVar86;
                            auVar138._20_4_ = uVar86;
                            auVar138._24_4_ = uVar86;
                            auVar138._28_4_ = uVar86;
                            auVar149 = vpsrld_avx2(auVar138,0x10);
                            auVar99 = vpblendw_avx2(auVar138,ZEXT832(0) << 0x20,0xaa);
                            auVar99 = vcvtdq2ps_avx(auVar99);
                            auVar149 = vcvtdq2ps_avx(auVar149);
                            uVar86 = *(undefined4 *)(local_2f20 + lVar85);
                            auVar152._4_4_ = uVar86;
                            auVar152._0_4_ = uVar86;
                            auVar152._8_4_ = uVar86;
                            auVar152._12_4_ = uVar86;
                            auVar152._16_4_ = uVar86;
                            auVar152._20_4_ = uVar86;
                            auVar152._24_4_ = uVar86;
                            auVar152._28_4_ = uVar86;
                            auVar144 = vsubps_avx(auVar163,auVar116);
                            auVar144 = vsubps_avx(auVar144,auVar115);
                            auVar55._4_4_ = auVar144._4_4_ * auVar99._4_4_ * 0.00012207031;
                            auVar55._0_4_ = auVar144._0_4_ * auVar99._0_4_ * 0.00012207031;
                            auVar55._8_4_ = auVar144._8_4_ * auVar99._8_4_ * 0.00012207031;
                            auVar55._12_4_ = auVar144._12_4_ * auVar99._12_4_ * 0.00012207031;
                            auVar55._16_4_ = auVar144._16_4_ * auVar99._16_4_ * 0.00012207031;
                            auVar55._20_4_ = auVar144._20_4_ * auVar99._20_4_ * 0.00012207031;
                            auVar55._24_4_ = auVar144._24_4_ * auVar99._24_4_ * 0.00012207031;
                            auVar55._28_4_ = auVar99._28_4_;
                            auVar56._4_4_ = auVar144._4_4_ * auVar149._4_4_ * 0.00012207031;
                            auVar56._0_4_ = auVar144._0_4_ * auVar149._0_4_ * 0.00012207031;
                            auVar56._8_4_ = auVar144._8_4_ * auVar149._8_4_ * 0.00012207031;
                            auVar56._12_4_ = auVar144._12_4_ * auVar149._12_4_ * 0.00012207031;
                            auVar56._16_4_ = auVar144._16_4_ * auVar149._16_4_ * 0.00012207031;
                            auVar56._20_4_ = auVar144._20_4_ * auVar149._20_4_ * 0.00012207031;
                            auVar56._24_4_ = auVar144._24_4_ * auVar149._24_4_ * 0.00012207031;
                            auVar56._28_4_ = auVar149._28_4_;
                            auVar99 = vpblendw_avx2(auVar152,ZEXT832(0) << 0x20,0xaa);
                            auVar99 = vcvtdq2ps_avx(auVar99);
                            auVar155._0_4_ = auVar99._0_4_ * 0.00012207031;
                            auVar155._4_4_ = auVar99._4_4_ * 0.00012207031;
                            auVar155._8_4_ = auVar99._8_4_ * 0.00012207031;
                            auVar155._12_4_ = auVar99._12_4_ * 0.00012207031;
                            auVar57._16_4_ = auVar99._16_4_ * 0.00012207031;
                            auVar57._0_16_ = auVar155;
                            auVar57._20_4_ = auVar99._20_4_ * 0.00012207031;
                            auVar57._24_4_ = auVar99._24_4_ * 0.00012207031;
                            auVar57._28_4_ = auVar99._28_4_;
                            auVar109 = vfmadd231ps_fma(auVar55,auVar115,auVar57);
                            auVar99 = vpsrld_avx2(auVar152,0x10);
                            auVar99 = vcvtdq2ps_avx(auVar99);
                            auVar58._4_4_ = auVar99._4_4_ * 0.00012207031;
                            auVar58._0_4_ = auVar99._0_4_ * 0.00012207031;
                            auVar58._8_4_ = auVar99._8_4_ * 0.00012207031;
                            auVar58._12_4_ = auVar99._12_4_ * 0.00012207031;
                            auVar58._16_4_ = auVar99._16_4_ * 0.00012207031;
                            auVar58._20_4_ = auVar99._20_4_ * 0.00012207031;
                            auVar58._24_4_ = auVar99._24_4_ * 0.00012207031;
                            auVar58._28_4_ = auVar99._28_4_;
                            auVar18 = vfmadd231ps_fma(auVar56,auVar115,auVar58);
                            uVar86 = *(undefined4 *)(local_2f28 + lVar85);
                            auVar117._4_4_ = uVar86;
                            auVar117._0_4_ = uVar86;
                            auVar117._8_4_ = uVar86;
                            auVar117._12_4_ = uVar86;
                            auVar117._16_4_ = uVar86;
                            auVar117._20_4_ = uVar86;
                            auVar117._24_4_ = uVar86;
                            auVar117._28_4_ = uVar86;
                            auVar99 = vpblendw_avx2(auVar117,ZEXT832(0) << 0x20,0xaa);
                            auVar99 = vcvtdq2ps_avx(auVar99);
                            auVar59._4_4_ = auVar99._4_4_ * 0.00012207031;
                            auVar59._0_4_ = auVar99._0_4_ * 0.00012207031;
                            auVar59._8_4_ = auVar99._8_4_ * 0.00012207031;
                            auVar59._12_4_ = auVar99._12_4_ * 0.00012207031;
                            auVar59._16_4_ = auVar99._16_4_ * 0.00012207031;
                            auVar59._20_4_ = auVar99._20_4_ * 0.00012207031;
                            auVar59._24_4_ = auVar99._24_4_ * 0.00012207031;
                            auVar59._28_4_ = auVar99._28_4_;
                            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar116,auVar59);
                            auVar99 = vpsrld_avx2(auVar117,0x10);
                            auVar99 = vcvtdq2ps_avx(auVar99);
                            auVar60._4_4_ = auVar99._4_4_ * 0.00012207031;
                            auVar60._0_4_ = auVar99._0_4_ * 0.00012207031;
                            auVar60._8_4_ = auVar99._8_4_ * 0.00012207031;
                            auVar60._12_4_ = auVar99._12_4_ * 0.00012207031;
                            auVar60._16_4_ = auVar99._16_4_ * 0.00012207031;
                            auVar60._20_4_ = auVar99._20_4_ * 0.00012207031;
                            auVar60._24_4_ = auVar99._24_4_ * 0.00012207031;
                            auVar60._28_4_ = auVar99._28_4_;
                            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar116,auVar60);
                            local_2c40._0_8_ = local_2780._0_8_;
                            local_2c40._8_8_ = local_2780._8_8_;
                            local_2c40._16_8_ = local_2780._16_8_;
                            local_2c40._24_8_ = local_2780._24_8_;
                            local_2c40._32_8_ = local_27a0._0_8_;
                            local_2c40._40_8_ = local_27a0._8_8_;
                            local_2c40._48_8_ = local_27a0._16_8_;
                            local_2c40._56_8_ = local_27a0._24_8_;
                            local_2c40.field_0.z.field_0 =
                                 (vfloat_impl<8>)(vfloat_impl<8>)local_27c0;
                            local_2be0 = local_2760._0_8_;
                            uStack_2bd8 = local_2760._8_8_;
                            uStack_2bd0 = local_2760._16_8_;
                            uStack_2bc8 = local_2760._24_8_;
                            local_2bc0 = ZEXT1632(auVar18);
                            local_2ba0 = ZEXT1632(auVar109);
                            local_2f90.valid = (int *)&local_2b00;
                            local_2f90.geometryUserPtr = &local_2ca0;
                            local_2f90.context = local_2c80;
                            local_2f90.ray = (RTCRayN *)&local_2c60;
                            auVar165 = ZEXT1664(auVar155);
                            auVar171 = ZEXT1664(CONCAT412(0x39000000,
                                                          CONCAT48(0x39000000,0x3900000039000000)));
                            auVar181 = ZEXT1664(auVar179._0_16_);
                            auVar183 = (undefined1  [36])0x0;
                            _local_2ee0 = auVar192;
                            local_2da0 = auVar175;
                            local_2d60 = auVar154;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                            ::
                            _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                        *)&local_2f90,
                                       (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                        *)&local_2c40.field_0);
                            pRVar4 = context->user;
                            local_2ba0._4_4_ = local_2e20._0_4_;
                            local_2ba0._0_4_ = local_2e20._0_4_;
                            local_2ba0._8_4_ = local_2e20._0_4_;
                            local_2ba0._12_4_ = local_2e20._0_4_;
                            local_2ba0._16_4_ = local_2e20._0_4_;
                            local_2ba0._20_4_ = local_2e20._0_4_;
                            local_2ba0._24_4_ = local_2e20._0_4_;
                            local_2ba0._28_4_ = local_2e20._0_4_;
                            local_2c40._0_8_ = local_2b00;
                            local_2c40._8_8_ = uStack_2af8;
                            local_2c40._16_8_ = uStack_2af0;
                            local_2c40._24_8_ = uStack_2ae8;
                            local_2c40._32_8_ = local_2ae0;
                            local_2c40._40_8_ = uStack_2ad8;
                            local_2c40._48_8_ = uStack_2ad0;
                            local_2c40._56_8_ = uStack_2ac8;
                            local_2c40.field_0.z.field_0 =
                                 (vfloat_impl<8>)(vfloat_impl<8>)local_2ac0;
                            local_2be0 = local_2c60._0_8_;
                            uStack_2bd8 = local_2c60._8_8_;
                            uStack_2bd0 = local_2c60._16_8_;
                            uStack_2bc8 = local_2c60._24_8_;
                            auVar119 = vpcmpeqd_avx2(local_2ba0,local_2ba0);
                            local_2e88[1] = auVar119;
                            *local_2e88 = auVar119;
                            local_2b60 = pRVar4->instID[0];
                            local_2b40 = pRVar4->instPrimID[0];
                            local_2e20 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar154 = vblendvps_avx(local_2e20,(undefined1  [32])local_2ca0,
                                                     local_2d60);
                            *(undefined1 (*) [32])(ray + 0x100) = auVar154;
                            local_2e00 = local_2d60;
                            local_2f90.valid = (int *)local_2e00;
                            local_2f90.geometryUserPtr = unaff_R13->userPtr;
                            local_2f90.context = context->user;
                            local_2f90.hit = (RTCHitN *)&local_2c40;
                            local_2f90.N = 8;
                            local_2f90.ray = (RTCRayN *)ray;
                            local_2b80 = uVar3;
                            uStack_2b7c = uVar3;
                            uStack_2b78 = uVar3;
                            uStack_2b74 = uVar3;
                            uStack_2b70 = uVar3;
                            uStack_2b6c = uVar3;
                            uStack_2b68 = uVar3;
                            uStack_2b64 = uVar3;
                            uStack_2b5c = local_2b60;
                            uStack_2b58 = local_2b60;
                            uStack_2b54 = local_2b60;
                            uStack_2b50 = local_2b60;
                            uStack_2b4c = local_2b60;
                            uStack_2b48 = local_2b60;
                            uStack_2b44 = local_2b60;
                            uStack_2b3c = local_2b40;
                            uStack_2b38 = local_2b40;
                            uStack_2b34 = local_2b40;
                            uStack_2b30 = local_2b40;
                            uStack_2b2c = local_2b40;
                            uStack_2b28 = local_2b40;
                            uStack_2b24 = local_2b40;
                            if (unaff_R13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar165 = ZEXT1664(auVar165._0_16_);
                              auVar171 = ZEXT1664(auVar171._0_16_);
                              auVar181 = ZEXT1664(auVar181._0_16_);
                              auVar183 = (undefined1  [36])0x0;
                              (*unaff_R13->occlusionFilterN)(&local_2f90);
                              auVar182._8_56_ = extraout_var;
                              auVar182._0_8_ = extraout_XMM1_Qa;
                              auVar119 = vpcmpeqd_avx2(auVar182._0_32_,auVar182._0_32_);
                            }
                            auVar154 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                            auVar99 = auVar119 & ~auVar154;
                            auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                          CONCAT424(0x3f7ffffa,
                                                                    CONCAT420(0x3f7ffffa,
                                                                              CONCAT416(0x3f7ffffa,
                                                                                        CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                            auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                                          CONCAT424(0x3f800003,
                                                                    CONCAT420(0x3f800003,
                                                                              CONCAT416(0x3f800003,
                                                                                        CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                            auVar189 = ZEXT3264(local_2e40);
                            if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar99 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar99 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar99 >> 0x7f,0) == '\0') &&
                                  (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar99 >> 0xbf,0) == '\0') &&
                                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar99[0x1f]) {
                              auVar154 = auVar154 ^ auVar119;
                              auVar82 = local_2f00;
                              pGVar87 = (Geometry *)local_2ec0._0_8_;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((unaff_R13->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar165 = ZEXT1664(auVar165._0_16_);
                                auVar171 = ZEXT1664(auVar171._0_16_);
                                auVar181 = ZEXT1664(auVar181._0_16_);
                                auVar183 = (undefined1  [36])0x0;
                                (*p_Var5)(&local_2f90);
                                auVar189 = ZEXT3264(local_2e40);
                                auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                                              CONCAT424(0x3f800003,
                                                                        CONCAT420(0x3f800003,
                                                                                  CONCAT416(
                                                  0x3f800003,
                                                  CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                  )))));
                                auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                              CONCAT424(0x3f7ffffa,
                                                                        CONCAT420(0x3f7ffffa,
                                                                                  CONCAT416(
                                                  0x3f7ffffa,
                                                  CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                  )))));
                              }
                              auVar99 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                              auVar154 = auVar99 ^ _DAT_01f7b020;
                              auVar119._8_4_ = 0xff800000;
                              auVar119._0_8_ = 0xff800000ff800000;
                              auVar119._12_4_ = 0xff800000;
                              auVar119._16_4_ = 0xff800000;
                              auVar119._20_4_ = 0xff800000;
                              auVar119._24_4_ = 0xff800000;
                              auVar119._28_4_ = 0xff800000;
                              auVar99 = vblendvps_avx(auVar119,*(undefined1 (*) [32])
                                                                (local_2f90.ray + 0x100),auVar99);
                              *(undefined1 (*) [32])(local_2f90.ray + 0x100) = auVar99;
                              auVar82 = local_2f00;
                              pGVar87 = (Geometry *)local_2ec0._0_8_;
                            }
                            auVar122 = ZEXT3264(auVar119);
                            auVar99 = vblendvps_avx(local_2e20,*(undefined1 (*) [32])local_2f30,
                                                    auVar154);
                            *(undefined1 (*) [32])local_2f30 = auVar99;
                            auVar192 = _local_2ee0;
                            auVar175 = local_2da0;
                            auVar157 = local_2e40;
                          }
                          local_2e40 = auVar157;
                          auVar154 = vandnps_avx(auVar154,local_2f60);
                          auVar157 = local_2e40;
                        }
                        local_2e40 = auVar157;
                        auVar141 = ZEXT3264(auVar154);
                        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar154 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar154 >> 0x7f,0) == '\0')
                              && (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar154 >> 0xbf,0) == '\0') &&
                            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar154[0x1f]) {
                          auVar182 = ZEXT3264(CONCAT428(0x7f800000,
                                                        CONCAT424(0x7f800000,
                                                                  CONCAT420(0x7f800000,
                                                                            CONCAT416(0x7f800000,
                                                                                      CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                          goto LAB_015cf8a4;
                        }
                        auVar99 = *(undefined1 (*) [32])ray;
                        auVar149 = *(undefined1 (*) [32])(ray + 0x20);
                        auVar116 = *(undefined1 (*) [32])(ray + 0x40);
                        local_2d60 = vsubps_avx(local_2640,auVar99);
                        local_2e20 = vsubps_avx(local_2660,auVar149);
                        _local_2cc0 = vsubps_avx(local_2680,auVar116);
                        auVar115 = vsubps_avx(local_26a0,auVar99);
                        local_2e40 = vsubps_avx(local_26c0,auVar149);
                        _local_2ee0 = vsubps_avx(local_26e0,auVar116);
                        auVar144 = vsubps_avx(auVar192,auVar99);
                        auVar149 = vsubps_avx(auVar189._0_32_,auVar149);
                        local_2ec0._0_32_ = vsubps_avx(auVar175,auVar116);
                        local_2ce0 = vsubps_avx(auVar144,local_2d60);
                        local_2d20 = vsubps_avx(auVar149,local_2e20);
                        local_2d00 = vsubps_avx(local_2ec0._0_32_,_local_2cc0);
                        auVar146._0_4_ = auVar144._0_4_ + local_2d60._0_4_;
                        auVar146._4_4_ = auVar144._4_4_ + local_2d60._4_4_;
                        auVar146._8_4_ = auVar144._8_4_ + local_2d60._8_4_;
                        auVar146._12_4_ = auVar144._12_4_ + local_2d60._12_4_;
                        auVar146._16_4_ = auVar144._16_4_ + local_2d60._16_4_;
                        auVar146._20_4_ = auVar144._20_4_ + local_2d60._20_4_;
                        auVar146._24_4_ = auVar144._24_4_ + local_2d60._24_4_;
                        auVar146._28_4_ = auVar144._28_4_ + local_2d60._28_4_;
                        auVar167._0_4_ = local_2e20._0_4_ + auVar149._0_4_;
                        auVar167._4_4_ = local_2e20._4_4_ + auVar149._4_4_;
                        auVar167._8_4_ = local_2e20._8_4_ + auVar149._8_4_;
                        auVar167._12_4_ = local_2e20._12_4_ + auVar149._12_4_;
                        auVar167._16_4_ = local_2e20._16_4_ + auVar149._16_4_;
                        auVar167._20_4_ = local_2e20._20_4_ + auVar149._20_4_;
                        auVar167._24_4_ = local_2e20._24_4_ + auVar149._24_4_;
                        auVar167._28_4_ = local_2e20._28_4_ + auVar149._28_4_;
                        fVar6 = local_2cc0._0_4_;
                        auVar176._0_4_ = local_2ec0._0_4_ + fVar6;
                        fVar7 = local_2cc0._4_4_;
                        auVar176._4_4_ = local_2ec0._4_4_ + fVar7;
                        fVar8 = local_2cc0._8_4_;
                        auVar176._8_4_ = local_2ec0._8_4_ + fVar8;
                        fVar9 = local_2cc0._12_4_;
                        auVar176._12_4_ = local_2ec0._12_4_ + fVar9;
                        fVar10 = local_2cc0._16_4_;
                        auVar176._16_4_ = local_2ec0._16_4_ + fVar10;
                        fVar11 = local_2cc0._20_4_;
                        auVar176._20_4_ = local_2ec0._20_4_ + fVar11;
                        fVar12 = local_2cc0._24_4_;
                        auVar176._24_4_ = local_2ec0._24_4_ + fVar12;
                        fVar107 = local_2cc0._28_4_;
                        fVar142 = local_2ec0._28_4_;
                        auVar176._28_4_ = fVar142 + fVar107;
                        auVar188._0_4_ = local_2d00._0_4_ * auVar167._0_4_;
                        auVar188._4_4_ = local_2d00._4_4_ * auVar167._4_4_;
                        auVar188._8_4_ = local_2d00._8_4_ * auVar167._8_4_;
                        auVar188._12_4_ = local_2d00._12_4_ * auVar167._12_4_;
                        auVar188._16_4_ = local_2d00._16_4_ * auVar167._16_4_;
                        auVar188._20_4_ = local_2d00._20_4_ * auVar167._20_4_;
                        auVar188._28_36_ = auVar185._28_36_;
                        auVar188._24_4_ = local_2d00._24_4_ * auVar167._24_4_;
                        auVar18 = vfmsub231ps_fma(auVar188._0_32_,local_2d20,auVar176);
                        auVar181._0_4_ = auVar176._0_4_ * local_2ce0._0_4_;
                        auVar181._4_4_ = auVar176._4_4_ * local_2ce0._4_4_;
                        auVar181._8_4_ = auVar176._8_4_ * local_2ce0._8_4_;
                        auVar181._12_4_ = auVar176._12_4_ * local_2ce0._12_4_;
                        auVar181._16_4_ = auVar176._16_4_ * local_2ce0._16_4_;
                        auVar181._20_4_ = auVar176._20_4_ * local_2ce0._20_4_;
                        auVar181._24_4_ = auVar176._24_4_ * local_2ce0._24_4_;
                        auVar181._28_36_ = auVar183;
                        auVar109 = vfmsub231ps_fma(auVar181._0_32_,local_2d00,auVar146);
                        auVar37._4_4_ = auVar146._4_4_ * local_2d20._4_4_;
                        auVar37._0_4_ = auVar146._0_4_ * local_2d20._0_4_;
                        auVar37._8_4_ = auVar146._8_4_ * local_2d20._8_4_;
                        auVar37._12_4_ = auVar146._12_4_ * local_2d20._12_4_;
                        auVar37._16_4_ = auVar146._16_4_ * local_2d20._16_4_;
                        auVar37._20_4_ = auVar146._20_4_ * local_2d20._20_4_;
                        auVar37._24_4_ = auVar146._24_4_ * local_2d20._24_4_;
                        auVar37._28_4_ = auVar146._28_4_;
                        auVar155 = vfmsub231ps_fma(auVar37,local_2ce0,auVar167);
                        pRVar1 = ray + 0xc0;
                        fVar108 = *(float *)pRVar1;
                        fVar124 = *(float *)(ray + 0xc4);
                        fVar126 = *(float *)(ray + 200);
                        fVar128 = *(float *)(ray + 0xcc);
                        fVar130 = *(float *)(ray + 0xd0);
                        fVar132 = *(float *)(ray + 0xd4);
                        fVar134 = *(float *)(ray + 0xd8);
                        auVar72 = *(undefined1 (*) [28])pRVar1;
                        auVar20 = *(undefined1 (*) [32])pRVar1;
                        auVar147._0_4_ = fVar108 * auVar155._0_4_;
                        auVar147._4_4_ = fVar124 * auVar155._4_4_;
                        auVar147._8_4_ = fVar126 * auVar155._8_4_;
                        auVar147._12_4_ = fVar128 * auVar155._12_4_;
                        auVar147._16_4_ = fVar130 * 0.0;
                        auVar147._20_4_ = fVar132 * 0.0;
                        auVar147._24_4_ = fVar134 * 0.0;
                        auVar147._28_4_ = 0;
                        local_2da0 = *(undefined1 (*) [32])(ray + 0xa0);
                        auVar109 = vfmadd231ps_fma(auVar147,local_2da0,ZEXT1632(auVar109));
                        auVar99 = *(undefined1 (*) [32])(ray + 0x80);
                        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar99,ZEXT1632(auVar18));
                        local_2d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                     vsubps_avx(local_2e20,local_2e40);
                        auVar157 = vsubps_avx(_local_2cc0,_local_2ee0);
                        auVar168._0_4_ = local_2e20._0_4_ + local_2e40._0_4_;
                        auVar168._4_4_ = local_2e20._4_4_ + local_2e40._4_4_;
                        auVar168._8_4_ = local_2e20._8_4_ + local_2e40._8_4_;
                        auVar168._12_4_ = local_2e20._12_4_ + local_2e40._12_4_;
                        auVar168._16_4_ = local_2e20._16_4_ + local_2e40._16_4_;
                        auVar168._20_4_ = local_2e20._20_4_ + local_2e40._20_4_;
                        auVar168._24_4_ = local_2e20._24_4_ + local_2e40._24_4_;
                        auVar168._28_4_ = local_2e20._28_4_ + local_2e40._28_4_;
                        auVar199._0_4_ = fVar6 + local_2ee0._0_4_;
                        auVar199._4_4_ = fVar7 + local_2ee0._4_4_;
                        auVar199._8_4_ = fVar8 + local_2ee0._8_4_;
                        auVar199._12_4_ = fVar9 + local_2ee0._12_4_;
                        auVar199._16_4_ = fVar10 + local_2ee0._16_4_;
                        auVar199._20_4_ = fVar11 + local_2ee0._20_4_;
                        auVar199._24_4_ = fVar12 + local_2ee0._24_4_;
                        auVar199._28_4_ = fVar107 + local_2ee0._28_4_;
                        fVar190 = auVar157._0_4_;
                        fVar191 = auVar157._4_4_;
                        auVar38._4_4_ = fVar191 * auVar168._4_4_;
                        auVar38._0_4_ = fVar190 * auVar168._0_4_;
                        fVar193 = auVar157._8_4_;
                        auVar38._8_4_ = fVar193 * auVar168._8_4_;
                        fVar194 = auVar157._12_4_;
                        auVar38._12_4_ = fVar194 * auVar168._12_4_;
                        fVar195 = auVar157._16_4_;
                        auVar38._16_4_ = fVar195 * auVar168._16_4_;
                        fVar196 = auVar157._20_4_;
                        auVar38._20_4_ = fVar196 * auVar168._20_4_;
                        fVar197 = auVar157._24_4_;
                        auVar38._24_4_ = fVar197 * auVar168._24_4_;
                        auVar38._28_4_ = fVar107;
                        auVar155 = vfmsub231ps_fma(auVar38,(undefined1  [32])local_2d40,auVar199);
                        auVar98 = vsubps_avx(local_2d60,auVar115);
                        auVar189 = ZEXT3264(auVar98);
                        fVar107 = auVar98._0_4_;
                        fVar105 = auVar98._4_4_;
                        auVar39._4_4_ = auVar199._4_4_ * fVar105;
                        auVar39._0_4_ = auVar199._0_4_ * fVar107;
                        fVar14 = auVar98._8_4_;
                        auVar39._8_4_ = auVar199._8_4_ * fVar14;
                        fVar16 = auVar98._12_4_;
                        auVar39._12_4_ = auVar199._12_4_ * fVar16;
                        fVar123 = auVar98._16_4_;
                        auVar39._16_4_ = auVar199._16_4_ * fVar123;
                        fVar127 = auVar98._20_4_;
                        auVar39._20_4_ = auVar199._20_4_ * fVar127;
                        fVar131 = auVar98._24_4_;
                        auVar39._24_4_ = auVar199._24_4_ * fVar131;
                        auVar39._28_4_ = auVar199._28_4_;
                        auVar170._0_4_ = auVar115._0_4_ + local_2d60._0_4_;
                        auVar170._4_4_ = auVar115._4_4_ + local_2d60._4_4_;
                        auVar170._8_4_ = auVar115._8_4_ + local_2d60._8_4_;
                        auVar170._12_4_ = auVar115._12_4_ + local_2d60._12_4_;
                        auVar170._16_4_ = auVar115._16_4_ + local_2d60._16_4_;
                        auVar170._20_4_ = auVar115._20_4_ + local_2d60._20_4_;
                        auVar170._24_4_ = auVar115._24_4_ + local_2d60._24_4_;
                        auVar170._28_4_ = auVar115._28_4_ + local_2d60._28_4_;
                        auVar18 = vfmsub231ps_fma(auVar39,auVar157,auVar170);
                        fVar104 = local_2d40.v[0];
                        fVar106 = local_2d40.v[1];
                        auVar40._4_4_ = auVar170._4_4_ * fVar106;
                        auVar40._0_4_ = auVar170._0_4_ * fVar104;
                        fVar15 = local_2d40.v[2];
                        auVar40._8_4_ = auVar170._8_4_ * fVar15;
                        fVar17 = local_2d40.v[3];
                        auVar40._12_4_ = auVar170._12_4_ * fVar17;
                        fVar125 = local_2d40.v[4];
                        auVar40._16_4_ = auVar170._16_4_ * fVar125;
                        fVar129 = local_2d40.v[5];
                        auVar40._20_4_ = auVar170._20_4_ * fVar129;
                        fVar133 = local_2d40.v[6];
                        auVar40._24_4_ = auVar170._24_4_ * fVar133;
                        auVar40._28_4_ = auVar170._28_4_;
                        auVar156 = vfmsub231ps_fma(auVar40,auVar98,auVar168);
                        auVar41._4_4_ = fVar124 * auVar156._4_4_;
                        auVar41._0_4_ = fVar108 * auVar156._0_4_;
                        auVar41._8_4_ = fVar126 * auVar156._8_4_;
                        auVar41._12_4_ = fVar128 * auVar156._12_4_;
                        auVar41._16_4_ = fVar130 * 0.0;
                        auVar41._20_4_ = fVar132 * 0.0;
                        auVar41._24_4_ = fVar134 * 0.0;
                        auVar41._28_4_ = auVar168._28_4_;
                        auVar18 = vfmadd231ps_fma(auVar41,local_2da0,ZEXT1632(auVar18));
                        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar99,ZEXT1632(auVar155));
                        auVar178 = vsubps_avx(auVar115,auVar144);
                        auVar114._0_4_ = auVar115._0_4_ + auVar144._0_4_;
                        auVar114._4_4_ = auVar115._4_4_ + auVar144._4_4_;
                        auVar114._8_4_ = auVar115._8_4_ + auVar144._8_4_;
                        auVar114._12_4_ = auVar115._12_4_ + auVar144._12_4_;
                        auVar114._16_4_ = auVar115._16_4_ + auVar144._16_4_;
                        auVar114._20_4_ = auVar115._20_4_ + auVar144._20_4_;
                        auVar114._24_4_ = auVar115._24_4_ + auVar144._24_4_;
                        auVar114._28_4_ = auVar115._28_4_ + auVar144._28_4_;
                        auVar184 = vsubps_avx(local_2e40,auVar149);
                        auVar100._0_4_ = local_2e40._0_4_ + auVar149._0_4_;
                        auVar100._4_4_ = local_2e40._4_4_ + auVar149._4_4_;
                        auVar100._8_4_ = local_2e40._8_4_ + auVar149._8_4_;
                        auVar100._12_4_ = local_2e40._12_4_ + auVar149._12_4_;
                        auVar100._16_4_ = local_2e40._16_4_ + auVar149._16_4_;
                        auVar100._20_4_ = local_2e40._20_4_ + auVar149._20_4_;
                        auVar100._24_4_ = local_2e40._24_4_ + auVar149._24_4_;
                        auVar100._28_4_ = local_2e40._28_4_ + auVar149._28_4_;
                        auVar180 = vsubps_avx(_local_2ee0,local_2ec0._0_32_);
                        auVar137._0_4_ = local_2ee0._0_4_ + local_2ec0._0_4_;
                        auVar137._4_4_ = local_2ee0._4_4_ + local_2ec0._4_4_;
                        auVar137._8_4_ = local_2ee0._8_4_ + local_2ec0._8_4_;
                        auVar137._12_4_ = local_2ee0._12_4_ + local_2ec0._12_4_;
                        auVar137._16_4_ = local_2ee0._16_4_ + local_2ec0._16_4_;
                        auVar137._20_4_ = local_2ee0._20_4_ + local_2ec0._20_4_;
                        auVar137._24_4_ = local_2ee0._24_4_ + local_2ec0._24_4_;
                        auVar137._28_4_ = local_2ee0._28_4_ + fVar142;
                        auVar42._4_4_ = auVar180._4_4_ * auVar100._4_4_;
                        auVar42._0_4_ = auVar180._0_4_ * auVar100._0_4_;
                        auVar42._8_4_ = auVar180._8_4_ * auVar100._8_4_;
                        auVar42._12_4_ = auVar180._12_4_ * auVar100._12_4_;
                        auVar42._16_4_ = auVar180._16_4_ * auVar100._16_4_;
                        auVar42._20_4_ = auVar180._20_4_ * auVar100._20_4_;
                        auVar42._24_4_ = auVar180._24_4_ * auVar100._24_4_;
                        auVar42._28_4_ = fVar142;
                        auVar156 = vfmsub231ps_fma(auVar42,auVar184,auVar137);
                        auVar43._4_4_ = auVar178._4_4_ * auVar137._4_4_;
                        auVar43._0_4_ = auVar178._0_4_ * auVar137._0_4_;
                        auVar43._8_4_ = auVar178._8_4_ * auVar137._8_4_;
                        auVar43._12_4_ = auVar178._12_4_ * auVar137._12_4_;
                        auVar43._16_4_ = auVar178._16_4_ * auVar137._16_4_;
                        auVar43._20_4_ = auVar178._20_4_ * auVar137._20_4_;
                        auVar43._24_4_ = auVar178._24_4_ * auVar137._24_4_;
                        auVar43._28_4_ = auVar137._28_4_;
                        auVar155 = vfmsub231ps_fma(auVar43,auVar180,auVar114);
                        auVar44._4_4_ = auVar184._4_4_ * auVar114._4_4_;
                        auVar44._0_4_ = auVar184._0_4_ * auVar114._0_4_;
                        auVar44._8_4_ = auVar184._8_4_ * auVar114._8_4_;
                        auVar44._12_4_ = auVar184._12_4_ * auVar114._12_4_;
                        auVar44._16_4_ = auVar184._16_4_ * auVar114._16_4_;
                        auVar44._20_4_ = auVar184._20_4_ * auVar114._20_4_;
                        auVar44._24_4_ = auVar184._24_4_ * auVar114._24_4_;
                        auVar44._28_4_ = auVar114._28_4_;
                        auVar19 = vfmsub231ps_fma(auVar44,auVar178,auVar100);
                        auVar45._4_4_ = fVar124 * auVar19._4_4_;
                        auVar45._0_4_ = fVar108 * auVar19._0_4_;
                        auVar45._8_4_ = fVar126 * auVar19._8_4_;
                        auVar45._12_4_ = fVar128 * auVar19._12_4_;
                        auVar45._16_4_ = fVar130 * 0.0;
                        auVar45._20_4_ = fVar132 * 0.0;
                        auVar45._24_4_ = fVar134 * 0.0;
                        auVar45._28_4_ = auVar100._28_4_;
                        auVar155 = vfmadd231ps_fma(auVar45,local_2da0,ZEXT1632(auVar155));
                        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar99,ZEXT1632(auVar156));
                        auVar160 = ZEXT1632(CONCAT412(auVar155._12_4_ +
                                                      auVar109._12_4_ + auVar18._12_4_,
                                                      CONCAT48(auVar155._8_4_ +
                                                               auVar109._8_4_ + auVar18._8_4_,
                                                               CONCAT44(auVar155._4_4_ +
                                                                        auVar109._4_4_ +
                                                                        auVar18._4_4_,
                                                                        auVar155._0_4_ +
                                                                        auVar109._0_4_ +
                                                                        auVar18._0_4_))));
                        auVar149 = vandps_avx(auVar160,local_2b20);
                        fVar108 = auVar149._0_4_ * 1.1920929e-07;
                        fVar124 = auVar149._4_4_ * 1.1920929e-07;
                        auVar46._4_4_ = fVar124;
                        auVar46._0_4_ = fVar108;
                        fVar126 = auVar149._8_4_ * 1.1920929e-07;
                        auVar46._8_4_ = fVar126;
                        fVar128 = auVar149._12_4_ * 1.1920929e-07;
                        auVar46._12_4_ = fVar128;
                        fVar130 = auVar149._16_4_ * 1.1920929e-07;
                        auVar46._16_4_ = fVar130;
                        fVar132 = auVar149._20_4_ * 1.1920929e-07;
                        auVar46._20_4_ = fVar132;
                        fVar134 = auVar149._24_4_ * 1.1920929e-07;
                        auVar46._24_4_ = fVar134;
                        auVar46._28_4_ = auVar149._28_4_;
                        auVar148 = ZEXT1632(auVar109);
                        auVar116 = vminps_avx(auVar148,ZEXT1632(auVar18));
                        auVar116 = vminps_avx(auVar116,ZEXT1632(auVar155));
                        auVar151._0_4_ = (uint)fVar108 ^ local_2e60._0_4_;
                        auVar151._4_4_ = (uint)fVar124 ^ local_2e60._4_4_;
                        auVar151._8_4_ = (uint)fVar126 ^ local_2e60._8_4_;
                        auVar151._12_4_ = (uint)fVar128 ^ local_2e60._12_4_;
                        auVar151._16_4_ = (uint)fVar130 ^ local_2e60._16_4_;
                        auVar151._20_4_ = (uint)fVar132 ^ local_2e60._20_4_;
                        auVar151._24_4_ = (uint)fVar134 ^ local_2e60._24_4_;
                        auVar151._28_4_ = auVar149._28_4_ ^ local_2e60._28_4_;
                        auVar149 = vcmpps_avx(auVar116,auVar151,5);
                        auVar115 = vmaxps_avx(auVar148,ZEXT1632(auVar18));
                        auVar116 = vmaxps_avx(auVar115,ZEXT1632(auVar155));
                        auVar116 = vcmpps_avx(auVar116,auVar46,2);
                        auVar144 = vorps_avx(auVar149,auVar116);
                        auVar186 = auVar154 & auVar144;
                        auVar149 = vandps_avx(auVar144,auVar154);
                        auVar116 = auVar149;
                        auVar162 = auVar160;
                        if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar186 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar186 >> 0x7f,0) != '\0')
                              || (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar186 >> 0xbf,0) != '\0') ||
                            (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar186[0x1f] < '\0') {
                          auVar47._4_4_ = fVar106 * local_2d00._4_4_;
                          auVar47._0_4_ = fVar104 * local_2d00._0_4_;
                          auVar47._8_4_ = fVar15 * local_2d00._8_4_;
                          auVar47._12_4_ = fVar17 * local_2d00._12_4_;
                          auVar47._16_4_ = fVar125 * local_2d00._16_4_;
                          auVar47._20_4_ = fVar129 * local_2d00._20_4_;
                          auVar47._24_4_ = fVar133 * local_2d00._24_4_;
                          auVar47._28_4_ = auVar144._28_4_;
                          local_2ee0._4_4_ = fVar105 * local_2d20._4_4_;
                          local_2ee0._0_4_ = fVar107 * local_2d20._0_4_;
                          fStack_2ed8 = fVar14 * local_2d20._8_4_;
                          fStack_2ed4 = fVar16 * local_2d20._12_4_;
                          fStack_2ed0 = fVar123 * local_2d20._16_4_;
                          fStack_2ecc = fVar127 * local_2d20._20_4_;
                          fStack_2ec8 = fVar131 * local_2d20._24_4_;
                          uStack_2ec4 = auVar154._28_4_;
                          auVar109 = vfmsub213ps_fma(local_2d20,auVar157,auVar47);
                          auVar48._4_4_ = auVar184._4_4_ * fVar191;
                          auVar48._0_4_ = auVar184._0_4_ * fVar190;
                          auVar48._8_4_ = auVar184._8_4_ * fVar193;
                          auVar48._12_4_ = auVar184._12_4_ * fVar194;
                          auVar48._16_4_ = auVar184._16_4_ * fVar195;
                          auVar48._20_4_ = auVar184._20_4_ * fVar196;
                          auVar48._24_4_ = auVar184._24_4_ * fVar197;
                          auVar48._28_4_ = auVar154._28_4_;
                          auVar49._4_4_ = fVar105 * auVar180._4_4_;
                          auVar49._0_4_ = fVar107 * auVar180._0_4_;
                          auVar49._8_4_ = fVar14 * auVar180._8_4_;
                          auVar49._12_4_ = fVar16 * auVar180._12_4_;
                          auVar49._16_4_ = fVar123 * auVar180._16_4_;
                          auVar49._20_4_ = fVar127 * auVar180._20_4_;
                          auVar49._24_4_ = fVar131 * auVar180._24_4_;
                          auVar49._28_4_ = auVar115._28_4_;
                          auVar155 = vfmsub213ps_fma(auVar180,(undefined1  [32])local_2d40,auVar48);
                          auVar116 = vandps_avx(auVar47,local_2b20);
                          auVar115 = vandps_avx(auVar48,local_2b20);
                          auVar116 = vcmpps_avx(auVar116,auVar115,1);
                          auVar144 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar109),auVar116);
                          auVar161._0_4_ = auVar178._0_4_ * fVar104;
                          auVar161._4_4_ = auVar178._4_4_ * fVar106;
                          auVar161._8_4_ = auVar178._8_4_ * fVar15;
                          auVar161._12_4_ = auVar178._12_4_ * fVar17;
                          auVar161._16_4_ = auVar178._16_4_ * fVar125;
                          auVar161._20_4_ = auVar178._20_4_ * fVar129;
                          auVar161._24_4_ = auVar178._24_4_ * fVar133;
                          auVar161._28_4_ = 0;
                          auVar109 = vfmsub213ps_fma(auVar178,auVar157,auVar49);
                          auVar50._4_4_ = local_2ce0._4_4_ * fVar191;
                          auVar50._0_4_ = local_2ce0._0_4_ * fVar190;
                          auVar50._8_4_ = local_2ce0._8_4_ * fVar193;
                          auVar50._12_4_ = local_2ce0._12_4_ * fVar194;
                          auVar50._16_4_ = local_2ce0._16_4_ * fVar195;
                          auVar50._20_4_ = local_2ce0._20_4_ * fVar196;
                          auVar50._24_4_ = local_2ce0._24_4_ * fVar197;
                          auVar50._28_4_ = auVar115._28_4_;
                          auVar155 = vfmsub213ps_fma(local_2d00,auVar98,auVar50);
                          auVar116 = vandps_avx(auVar50,local_2b20);
                          auVar115 = vandps_avx(auVar49,local_2b20);
                          auVar116 = vcmpps_avx(auVar116,auVar115,1);
                          auVar157 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar155),auVar116);
                          auVar109 = vfmsub213ps_fma(local_2ce0,(undefined1  [32])local_2d40,
                                                     _local_2ee0);
                          auVar155 = vfmsub213ps_fma(auVar184,auVar98,auVar161);
                          auVar116 = vandps_avx(_local_2ee0,local_2b20);
                          auVar115 = vandps_avx(auVar161,local_2b20);
                          auVar116 = vcmpps_avx(auVar116,auVar115,1);
                          aVar13 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                   vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar109),auVar116);
                          local_2f00._0_4_ = auVar72._0_4_;
                          local_2f00._4_4_ = auVar72._4_4_;
                          auStack_2ef8._0_4_ = auVar72._8_4_;
                          auStack_2ef8._4_4_ = auVar72._12_4_;
                          fStack_2ef0 = auVar72._16_4_;
                          fStack_2eec = auVar72._20_4_;
                          fStack_2ee8 = auVar72._24_4_;
                          auVar51._4_4_ = aVar13.v[1] * (float)local_2f00._4_4_;
                          auVar51._0_4_ = aVar13.v[0] * (float)local_2f00._0_4_;
                          auVar51._8_4_ = aVar13.v[2] * (float)auStack_2ef8._0_4_;
                          auVar51._12_4_ = aVar13.v[3] * (float)auStack_2ef8._4_4_;
                          auVar51._16_4_ = aVar13.v[4] * fStack_2ef0;
                          auVar51._20_4_ = aVar13.v[5] * fStack_2eec;
                          auVar51._24_4_ = aVar13.v[6] * fStack_2ee8;
                          auVar51._28_4_ = auVar116._28_4_;
                          auVar109 = vfmadd213ps_fma(local_2da0,auVar157,auVar51);
                          auVar109 = vfmadd213ps_fma(auVar99,auVar144,ZEXT1632(auVar109));
                          fVar107 = auVar109._0_4_ + auVar109._0_4_;
                          fVar104 = auVar109._4_4_ + auVar109._4_4_;
                          fVar105 = auVar109._8_4_ + auVar109._8_4_;
                          fVar106 = auVar109._12_4_ + auVar109._12_4_;
                          auVar115 = ZEXT1632(CONCAT412(fVar106,CONCAT48(fVar105,CONCAT44(fVar104,
                                                  fVar107))));
                          auVar52._4_4_ = aVar13.v[1] * fVar7;
                          auVar52._0_4_ = aVar13.v[0] * fVar6;
                          auVar52._8_4_ = aVar13.v[2] * fVar8;
                          auVar52._12_4_ = aVar13.v[3] * fVar9;
                          auVar52._16_4_ = aVar13.v[4] * fVar10;
                          auVar52._20_4_ = aVar13.v[5] * fVar11;
                          auVar52._24_4_ = aVar13.v[6] * fVar12;
                          auVar52._28_4_ = 0;
                          auVar109 = vfmadd213ps_fma(local_2e20,auVar157,auVar52);
                          auVar155 = vfmadd213ps_fma(local_2d60,auVar144,ZEXT1632(auVar109));
                          auVar99 = vrcpps_avx(auVar115);
                          auVar180._8_4_ = 0x3f800000;
                          auVar180._0_8_ = 0x3f8000003f800000;
                          auVar180._12_4_ = 0x3f800000;
                          auVar180._16_4_ = 0x3f800000;
                          auVar180._20_4_ = 0x3f800000;
                          auVar180._24_4_ = 0x3f800000;
                          auVar180._28_4_ = 0x3f800000;
                          auVar109 = vfnmadd213ps_fma(auVar99,auVar115,auVar180);
                          auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar99,auVar99);
                          auVar162 = ZEXT1632(CONCAT412(auVar109._12_4_ *
                                                        (auVar155._12_4_ + auVar155._12_4_),
                                                        CONCAT48(auVar109._8_4_ *
                                                                 (auVar155._8_4_ + auVar155._8_4_),
                                                                 CONCAT44(auVar109._4_4_ *
                                                                          (auVar155._4_4_ +
                                                                          auVar155._4_4_),
                                                                          auVar109._0_4_ *
                                                                          (auVar155._0_4_ +
                                                                          auVar155._0_4_)))));
                          auVar99 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar162,2);
                          auVar116 = vcmpps_avx(auVar162,*(undefined1 (*) [32])(ray + 0x100),2);
                          auVar99 = vandps_avx(auVar116,auVar99);
                          auVar177._0_4_ = (uint)fVar107 ^ local_2e60._0_4_;
                          auVar177._4_4_ = (uint)fVar104 ^ local_2e60._4_4_;
                          auVar177._8_4_ = (uint)fVar105 ^ local_2e60._8_4_;
                          auVar177._12_4_ = (uint)fVar106 ^ local_2e60._12_4_;
                          auVar177._16_4_ = local_2e60._16_4_;
                          auVar177._20_4_ = local_2e60._20_4_;
                          auVar177._24_4_ = local_2e60._24_4_;
                          auVar177._28_4_ = local_2e60._28_4_;
                          auVar116 = vcmpps_avx(auVar177,auVar115,4);
                          auVar99 = vandps_avx(auVar116,auVar99);
                          auVar99 = vpslld_avx2(auVar99,0x1f);
                          auVar116 = vpsrad_avx2(auVar99,0x1f);
                          auVar99 = auVar149 & auVar116;
                          auVar116 = vandps_avx(auVar116,auVar149);
                          local_2ec0._0_32_ = auVar149;
                          local_2e40 = auVar160;
                          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar99 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar99 >> 0x7f,0) != '\0') ||
                                (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar99 >> 0xbf,0) != '\0') ||
                              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar99[0x1f] < '\0') {
                            local_28a0 = aVar13;
                            local_2880 = auVar157;
                            local_2860 = auVar144;
                            local_2840 = auVar162;
                            local_2820 = auVar160;
                            _local_2800 = ZEXT1632(auVar18);
                            _local_27e0 = auVar148;
                          }
                        }
                        auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                                      CONCAT424(0x3f800003,
                                                                CONCAT420(0x3f800003,
                                                                          CONCAT416(0x3f800003,
                                                                                    CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                        auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                      CONCAT424(0x3f7ffffa,
                                                                CONCAT420(0x3f7ffffa,
                                                                          CONCAT416(0x3f7ffffa,
                                                                                    CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                        auVar182 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar181 = ZEXT3264(auVar180);
                        auVar171 = ZEXT3264(local_2b20);
                        auVar165 = ZEXT3264(auVar162);
                        auVar122 = ZEXT3264(auVar116);
                        uVar3 = *(uint *)(local_2e70.super_Precalculations.grid + 0x18);
                        unaff_R13 = (context->scene->geometries).items[uVar3].ptr;
                        uVar2 = unaff_R13->mask;
                        auVar101._4_4_ = uVar2;
                        auVar101._0_4_ = uVar2;
                        auVar101._8_4_ = uVar2;
                        auVar101._12_4_ = uVar2;
                        auVar101._16_4_ = uVar2;
                        auVar101._20_4_ = uVar2;
                        auVar101._24_4_ = uVar2;
                        auVar101._28_4_ = uVar2;
                        auVar99 = vpand_avx2(auVar101,*(undefined1 (*) [32])(ray + 0x120));
                        auVar149 = vpcmpeqd_avx2(auVar99,_DAT_01f7b000);
                        auVar99 = auVar116 & ~auVar149;
                        _local_2f00 = auVar20;
                        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar99 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar99 >> 0x7f,0) != '\0') ||
                              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar99 >> 0xbf,0) != '\0') ||
                            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar99[0x1f] < '\0') {
                          local_2e60 = vandnps_avx(auVar149,auVar116);
                          local_2f60 = auVar154;
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (unaff_R13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_2ec0._0_8_ = pGVar87;
                            _auStack_2ef8 = auVar20._8_24_;
                            local_2f00 = auVar82;
                            auVar99 = vrcpps_avx(local_2820);
                            auVar154 = vandps_avx(local_2820,local_2b20);
                            auVar164._8_4_ = 0x3f800000;
                            auVar164._0_8_ = 0x3f8000003f800000;
                            auVar164._12_4_ = 0x3f800000;
                            auVar164._16_4_ = 0x3f800000;
                            auVar164._20_4_ = 0x3f800000;
                            auVar164._24_4_ = 0x3f800000;
                            auVar164._28_4_ = 0x3f800000;
                            auVar109 = vfnmadd213ps_fma(auVar99,local_2820,auVar164);
                            auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar99,auVar99);
                            auVar103._8_4_ = 0x219392ef;
                            auVar103._0_8_ = 0x219392ef219392ef;
                            auVar103._12_4_ = 0x219392ef;
                            auVar103._16_4_ = 0x219392ef;
                            auVar103._20_4_ = 0x219392ef;
                            auVar103._24_4_ = 0x219392ef;
                            auVar103._28_4_ = 0x219392ef;
                            auVar99 = vcmpps_avx(auVar154,auVar103,5);
                            auVar154 = vandps_avx(auVar99,ZEXT1632(auVar109));
                            auVar61._4_4_ = auVar154._4_4_ * (float)local_27e0._4_4_;
                            auVar61._0_4_ = auVar154._0_4_ * (float)local_27e0._0_4_;
                            auVar61._8_4_ = auVar154._8_4_ * fStack_27d8;
                            auVar61._12_4_ = auVar154._12_4_ * fStack_27d4;
                            auVar61._16_4_ = auVar154._16_4_ * fStack_27d0;
                            auVar61._20_4_ = auVar154._20_4_ * fStack_27cc;
                            auVar61._24_4_ = auVar154._24_4_ * fStack_27c8;
                            auVar61._28_4_ = auVar99._28_4_;
                            auVar149 = vminps_avx(auVar61,auVar164);
                            auVar62._4_4_ = auVar154._4_4_ * (float)local_2800._4_4_;
                            auVar62._0_4_ = auVar154._0_4_ * (float)local_2800._0_4_;
                            auVar62._8_4_ = auVar154._8_4_ * fStack_27f8;
                            auVar62._12_4_ = auVar154._12_4_ * fStack_27f4;
                            auVar62._16_4_ = auVar154._16_4_ * fStack_27f0;
                            auVar62._20_4_ = auVar154._20_4_ * fStack_27ec;
                            auVar62._24_4_ = auVar154._24_4_ * fStack_27e8;
                            auVar62._28_4_ = auVar154._28_4_;
                            auVar116 = vminps_avx(auVar62,auVar164);
                            uVar86 = *(undefined4 *)(local_2f20 + lVar85);
                            auVar139._4_4_ = uVar86;
                            auVar139._0_4_ = uVar86;
                            auVar139._8_4_ = uVar86;
                            auVar139._12_4_ = uVar86;
                            auVar139._16_4_ = uVar86;
                            auVar139._20_4_ = uVar86;
                            auVar139._24_4_ = uVar86;
                            auVar139._28_4_ = uVar86;
                            auVar99 = vpsrld_avx2(auVar139,0x10);
                            auVar154 = vpblendw_avx2(auVar139,ZEXT832(0) << 0x20,0xaa);
                            auVar154 = vcvtdq2ps_avx(auVar154);
                            auVar99 = vcvtdq2ps_avx(auVar99);
                            uVar86 = *(undefined4 *)(local_2f20 + lVar85 + 4);
                            auVar153._4_4_ = uVar86;
                            auVar153._0_4_ = uVar86;
                            auVar153._8_4_ = uVar86;
                            auVar153._12_4_ = uVar86;
                            auVar153._16_4_ = uVar86;
                            auVar153._20_4_ = uVar86;
                            auVar153._24_4_ = uVar86;
                            auVar153._28_4_ = uVar86;
                            auVar115 = vsubps_avx(auVar164,auVar149);
                            auVar115 = vsubps_avx(auVar115,auVar116);
                            auVar63._4_4_ = auVar115._4_4_ * auVar154._4_4_ * 0.00012207031;
                            auVar63._0_4_ = auVar115._0_4_ * auVar154._0_4_ * 0.00012207031;
                            auVar63._8_4_ = auVar115._8_4_ * auVar154._8_4_ * 0.00012207031;
                            auVar63._12_4_ = auVar115._12_4_ * auVar154._12_4_ * 0.00012207031;
                            auVar63._16_4_ = auVar115._16_4_ * auVar154._16_4_ * 0.00012207031;
                            auVar63._20_4_ = auVar115._20_4_ * auVar154._20_4_ * 0.00012207031;
                            auVar63._24_4_ = auVar115._24_4_ * auVar154._24_4_ * 0.00012207031;
                            auVar63._28_4_ = auVar154._28_4_;
                            auVar64._4_4_ = auVar115._4_4_ * auVar99._4_4_ * 0.00012207031;
                            auVar64._0_4_ = auVar115._0_4_ * auVar99._0_4_ * 0.00012207031;
                            auVar64._8_4_ = auVar115._8_4_ * auVar99._8_4_ * 0.00012207031;
                            auVar64._12_4_ = auVar115._12_4_ * auVar99._12_4_ * 0.00012207031;
                            auVar64._16_4_ = auVar115._16_4_ * auVar99._16_4_ * 0.00012207031;
                            auVar64._20_4_ = auVar115._20_4_ * auVar99._20_4_ * 0.00012207031;
                            auVar64._24_4_ = auVar115._24_4_ * auVar99._24_4_ * 0.00012207031;
                            auVar64._28_4_ = auVar99._28_4_;
                            auVar154 = vpblendw_avx2(auVar153,ZEXT832(0) << 0x20,0xaa);
                            auVar154 = vcvtdq2ps_avx(auVar154);
                            auVar156._0_4_ = auVar154._0_4_ * 0.00012207031;
                            auVar156._4_4_ = auVar154._4_4_ * 0.00012207031;
                            auVar156._8_4_ = auVar154._8_4_ * 0.00012207031;
                            auVar156._12_4_ = auVar154._12_4_ * 0.00012207031;
                            auVar65._16_4_ = auVar154._16_4_ * 0.00012207031;
                            auVar65._0_16_ = auVar156;
                            auVar65._20_4_ = auVar154._20_4_ * 0.00012207031;
                            auVar65._24_4_ = auVar154._24_4_ * 0.00012207031;
                            auVar65._28_4_ = auVar154._28_4_;
                            auVar109 = vfmadd231ps_fma(auVar63,auVar116,auVar65);
                            auVar154 = vpsrld_avx2(auVar153,0x10);
                            auVar154 = vcvtdq2ps_avx(auVar154);
                            auVar66._4_4_ = auVar154._4_4_ * 0.00012207031;
                            auVar66._0_4_ = auVar154._0_4_ * 0.00012207031;
                            auVar66._8_4_ = auVar154._8_4_ * 0.00012207031;
                            auVar66._12_4_ = auVar154._12_4_ * 0.00012207031;
                            auVar66._16_4_ = auVar154._16_4_ * 0.00012207031;
                            auVar66._20_4_ = auVar154._20_4_ * 0.00012207031;
                            auVar66._24_4_ = auVar154._24_4_ * 0.00012207031;
                            auVar66._28_4_ = auVar154._28_4_;
                            auVar18 = vfmadd231ps_fma(auVar64,auVar116,auVar66);
                            uVar86 = *(undefined4 *)(local_2f28 + lVar85);
                            auVar118._4_4_ = uVar86;
                            auVar118._0_4_ = uVar86;
                            auVar118._8_4_ = uVar86;
                            auVar118._12_4_ = uVar86;
                            auVar118._16_4_ = uVar86;
                            auVar118._20_4_ = uVar86;
                            auVar118._24_4_ = uVar86;
                            auVar118._28_4_ = uVar86;
                            auVar154 = vpblendw_avx2(auVar118,ZEXT832(0) << 0x20,0xaa);
                            auVar154 = vcvtdq2ps_avx(auVar154);
                            auVar67._4_4_ = auVar154._4_4_ * 0.00012207031;
                            auVar67._0_4_ = auVar154._0_4_ * 0.00012207031;
                            auVar67._8_4_ = auVar154._8_4_ * 0.00012207031;
                            auVar67._12_4_ = auVar154._12_4_ * 0.00012207031;
                            auVar67._16_4_ = auVar154._16_4_ * 0.00012207031;
                            auVar67._20_4_ = auVar154._20_4_ * 0.00012207031;
                            auVar67._24_4_ = auVar154._24_4_ * 0.00012207031;
                            auVar67._28_4_ = auVar154._28_4_;
                            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar149,auVar67);
                            auVar154 = vpsrld_avx2(auVar118,0x10);
                            auVar154 = vcvtdq2ps_avx(auVar154);
                            auVar68._4_4_ = auVar154._4_4_ * 0.00012207031;
                            auVar68._0_4_ = auVar154._0_4_ * 0.00012207031;
                            auVar68._8_4_ = auVar154._8_4_ * 0.00012207031;
                            auVar68._12_4_ = auVar154._12_4_ * 0.00012207031;
                            auVar68._16_4_ = auVar154._16_4_ * 0.00012207031;
                            auVar68._20_4_ = auVar154._20_4_ * 0.00012207031;
                            auVar68._24_4_ = auVar154._24_4_ * 0.00012207031;
                            auVar68._28_4_ = auVar154._28_4_;
                            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar149,auVar68);
                            local_2c40._0_8_ = local_2860._0_8_;
                            local_2c40._8_8_ = local_2860._8_8_;
                            local_2c40._16_8_ = local_2860._16_8_;
                            local_2c40._24_8_ = local_2860._24_8_;
                            local_2c40._32_8_ = local_2880._0_8_;
                            local_2c40._40_8_ = local_2880._8_8_;
                            local_2c40._48_8_ = local_2880._16_8_;
                            local_2c40._56_8_ = local_2880._24_8_;
                            local_2c40.field_0.z.field_0 =
                                 (vfloat_impl<8>)(vfloat_impl<8>)local_28a0;
                            local_2be0 = local_2840._0_8_;
                            uStack_2bd8 = local_2840._8_8_;
                            uStack_2bd0 = local_2840._16_8_;
                            uStack_2bc8 = local_2840._24_8_;
                            local_2bc0 = ZEXT1632(auVar18);
                            local_2ba0 = ZEXT1632(auVar109);
                            local_2f90.valid = (int *)&local_2b00;
                            local_2f90.geometryUserPtr = &local_2ca0;
                            local_2f90.context = local_2c80;
                            local_2f90.ray = (RTCRayN *)&local_2c60;
                            local_2ee0._0_4_ =
                                 *(undefined4 *)(local_2e70.super_Precalculations.grid + 0x1c);
                            auVar165 = ZEXT1664(auVar156);
                            auVar171 = ZEXT1664(CONCAT412(0x39000000,
                                                          CONCAT48(0x39000000,0x3900000039000000)));
                            auVar181 = ZEXT1664(auVar180._0_16_);
                            auVar189 = ZEXT1664(auVar98._0_16_);
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                            ::
                            _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                        *)&local_2f90,
                                       (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                        *)&local_2c40.field_0);
                            pRVar4 = context->user;
                            local_2ba0._4_4_ = local_2ee0._0_4_;
                            local_2ba0._0_4_ = local_2ee0._0_4_;
                            local_2ba0._8_4_ = local_2ee0._0_4_;
                            local_2ba0._12_4_ = local_2ee0._0_4_;
                            local_2ba0._16_4_ = local_2ee0._0_4_;
                            local_2ba0._20_4_ = local_2ee0._0_4_;
                            local_2ba0._24_4_ = local_2ee0._0_4_;
                            local_2ba0._28_4_ = local_2ee0._0_4_;
                            local_2c40._0_8_ = local_2b00;
                            local_2c40._8_8_ = uStack_2af8;
                            local_2c40._16_8_ = uStack_2af0;
                            local_2c40._24_8_ = uStack_2ae8;
                            local_2c40._32_8_ = local_2ae0;
                            local_2c40._40_8_ = uStack_2ad8;
                            local_2c40._48_8_ = uStack_2ad0;
                            local_2c40._56_8_ = uStack_2ac8;
                            local_2c40.field_0.z.field_0 =
                                 (vfloat_impl<8>)(vfloat_impl<8>)local_2ac0;
                            local_2be0 = local_2c60._0_8_;
                            uStack_2bd8 = local_2c60._8_8_;
                            uStack_2bd0 = local_2c60._16_8_;
                            uStack_2bc8 = local_2c60._24_8_;
                            auVar120 = vpcmpeqd_avx2(local_2ba0,local_2ba0);
                            local_2e88[1] = auVar120;
                            *local_2e88 = auVar120;
                            local_2b60 = pRVar4->instID[0];
                            local_2b40 = pRVar4->instPrimID[0];
                            _local_2ee0 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar154 = vblendvps_avx(_local_2ee0,(undefined1  [32])local_2ca0,
                                                     local_2e60);
                            *(undefined1 (*) [32])(ray + 0x100) = auVar154;
                            local_2e00 = local_2e60;
                            local_2f90.valid = (int *)local_2e00;
                            local_2f90.geometryUserPtr = unaff_R13->userPtr;
                            local_2f90.context = context->user;
                            local_2f90.hit = (RTCHitN *)&local_2c40;
                            local_2f90.N = 8;
                            local_2f90.ray = (RTCRayN *)ray;
                            local_2b80 = uVar3;
                            uStack_2b7c = uVar3;
                            uStack_2b78 = uVar3;
                            uStack_2b74 = uVar3;
                            uStack_2b70 = uVar3;
                            uStack_2b6c = uVar3;
                            uStack_2b68 = uVar3;
                            uStack_2b64 = uVar3;
                            uStack_2b5c = local_2b60;
                            uStack_2b58 = local_2b60;
                            uStack_2b54 = local_2b60;
                            uStack_2b50 = local_2b60;
                            uStack_2b4c = local_2b60;
                            uStack_2b48 = local_2b60;
                            uStack_2b44 = local_2b60;
                            uStack_2b3c = local_2b40;
                            uStack_2b38 = local_2b40;
                            uStack_2b34 = local_2b40;
                            uStack_2b30 = local_2b40;
                            uStack_2b2c = local_2b40;
                            uStack_2b28 = local_2b40;
                            uStack_2b24 = local_2b40;
                            if (unaff_R13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar165 = ZEXT1664(auVar165._0_16_);
                              auVar171 = ZEXT1664(auVar171._0_16_);
                              auVar181 = ZEXT1664(auVar181._0_16_);
                              auVar189 = ZEXT1664(auVar189._0_16_);
                              (*unaff_R13->occlusionFilterN)(&local_2f90);
                              auVar185._8_56_ = extraout_var_00;
                              auVar185._0_8_ = extraout_XMM1_Qa_00;
                              auVar120 = vpcmpeqd_avx2(auVar185._0_32_,auVar185._0_32_);
                            }
                            auVar99 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                            auVar154 = auVar120 & ~auVar99;
                            auVar182 = ZEXT3264(CONCAT428(0x7f800000,
                                                          CONCAT424(0x7f800000,
                                                                    CONCAT420(0x7f800000,
                                                                              CONCAT416(0x7f800000,
                                                                                        CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                            auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                          CONCAT424(0x3f7ffffa,
                                                                    CONCAT420(0x3f7ffffa,
                                                                              CONCAT416(0x3f7ffffa,
                                                                                        CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                            auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                                          CONCAT424(0x3f800003,
                                                                    CONCAT420(0x3f800003,
                                                                              CONCAT416(0x3f800003,
                                                                                        CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                            if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar154 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar154 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar154 >> 0x7f,0) == '\0') &&
                                  (auVar154 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar154 >> 0xbf,0) == '\0') &&
                                (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar154[0x1f]) {
                              local_2e60 = auVar99 ^ auVar120;
                              auVar82 = local_2f00;
                              pGVar87 = (Geometry *)local_2ec0._0_8_;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((unaff_R13->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar165 = ZEXT1664(auVar165._0_16_);
                                auVar171 = ZEXT1664(auVar171._0_16_);
                                auVar181 = ZEXT1664(auVar181._0_16_);
                                auVar189 = ZEXT1664(auVar189._0_16_);
                                (*p_Var5)(&local_2f90);
                                auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                                              CONCAT424(0x3f800003,
                                                                        CONCAT420(0x3f800003,
                                                                                  CONCAT416(
                                                  0x3f800003,
                                                  CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                  )))));
                                auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                              CONCAT424(0x3f7ffffa,
                                                                        CONCAT420(0x3f7ffffa,
                                                                                  CONCAT416(
                                                  0x3f7ffffa,
                                                  CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                  )))));
                                auVar182 = ZEXT3264(CONCAT428(0x7f800000,
                                                              CONCAT424(0x7f800000,
                                                                        CONCAT420(0x7f800000,
                                                                                  CONCAT416(
                                                  0x7f800000,
                                                  CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                  )))));
                              }
                              auVar154 = vpcmpeqd_avx2(local_2e00,_DAT_01f7b000);
                              local_2e60 = auVar154 ^ _DAT_01f7b020;
                              auVar120._8_4_ = 0xff800000;
                              auVar120._0_8_ = 0xff800000ff800000;
                              auVar120._12_4_ = 0xff800000;
                              auVar120._16_4_ = 0xff800000;
                              auVar120._20_4_ = 0xff800000;
                              auVar120._24_4_ = 0xff800000;
                              auVar120._28_4_ = 0xff800000;
                              auVar154 = vblendvps_avx(auVar120,*(undefined1 (*) [32])
                                                                 (local_2f90.ray + 0x100),auVar154);
                              *(undefined1 (*) [32])(local_2f90.ray + 0x100) = auVar154;
                              auVar82 = local_2f00;
                              pGVar87 = (Geometry *)local_2ec0._0_8_;
                            }
                            auVar122 = ZEXT3264(auVar120);
                            auVar154 = vblendvps_avx(_local_2ee0,*(undefined1 (*) [32])local_2f30,
                                                     local_2e60);
                            *(undefined1 (*) [32])local_2f30 = auVar154;
                          }
                          auVar154 = vandnps_avx(local_2e60,local_2f60);
                          auVar99 = local_2f60 & ~local_2e60;
                          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar99 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar99 >> 0x7f,0) == '\0') &&
                                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar99 >> 0xbf,0) == '\0') &&
                              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar99[0x1f]) {
                            auVar141 = ZEXT3264(auVar154);
                            goto LAB_015cf8a4;
                          }
                        }
                        local_2f60 = auVar154;
                      }
                      auVar141 = ZEXT3264(local_2f60);
LAB_015cf8a4:
                      local_2f20 = local_2f20 + local_2dc0;
                      local_2f08 = local_2f08 + local_2dc0;
                      local_2f10 = local_2f10 + local_2dc0;
                      local_2f18 = local_2f18 + local_2dc0;
                      local_2f28 = local_2f28 + local_2dc0;
                      local_2e78 = local_2e78 + local_2dc0;
                      local_2e80 = local_2e80 + local_2dc0;
                      lVar77 = local_2db0 + local_2dc0;
                      pGVar76 = local_2db8;
                    }
                    auVar154 = vpcmpeqd_avx2(auVar122._0_32_,auVar122._0_32_);
                    uVar75 = 0;
                    auVar99 = auVar141._0_32_ ^ auVar154;
                  }
                  else {
                    local_2e70.super_Precalculations.grid =
                         (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                    uVar75 = *(ulong *)(local_2e70.super_Precalculations.grid +
                                       (ulong)*(uint *)(local_2e70.super_Precalculations.grid + 0x2c
                                                       ) + 0x30);
                    auVar154 = vpcmpeqd_avx2(auVar122._0_32_,auVar122._0_32_);
                    auVar99 = local_28e0;
                  }
                  local_2d80 = vpor_avx2(auVar99,local_2d80);
                  auVar154 = auVar154 & ~local_2d80;
                  if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar154 >> 0x7f,0) == '\0') &&
                        (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar154 >> 0xbf,0) == '\0') &&
                      (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar154[0x1f]) goto LAB_015cfa85;
                  auVar122 = ZEXT3264(local_2900);
                  auVar140._8_4_ = 0xff800000;
                  auVar140._0_8_ = 0xff800000ff800000;
                  auVar140._12_4_ = 0xff800000;
                  auVar140._16_4_ = 0xff800000;
                  auVar140._20_4_ = 0xff800000;
                  auVar140._24_4_ = 0xff800000;
                  auVar140._28_4_ = 0xff800000;
                  local_2900 = vblendvps_avx(local_2900,auVar140,local_2d80);
                  if (uVar75 != 0) {
                    *puVar88 = uVar75;
                    puVar88 = puVar88 + 1;
                    *(undefined4 *)*pauVar79 = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 4) = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 8) = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 0xc) = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 0x10) = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 0x14) = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 0x18) = 0xff800000;
                    *(undefined4 *)(*pauVar79 + 0x1c) = 0xff800000;
                    pauVar79 = pauVar79 + 1;
                  }
                }
                goto LAB_015ce27d;
              }
              uVar75 = 8;
              auVar154 = auVar182._0_32_;
              for (lVar77 = 0;
                  (auVar189 = ZEXT3264(auVar154), lVar77 != 4 &&
                  (uVar78 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar77 * 8), uVar78 != 8));
                  lVar77 = lVar77 + 1) {
                uVar86 = *(undefined4 *)(root.ptr + 0x20 + lVar77 * 4);
                auVar89._4_4_ = uVar86;
                auVar89._0_4_ = uVar86;
                auVar89._8_4_ = uVar86;
                auVar89._12_4_ = uVar86;
                auVar89._16_4_ = uVar86;
                auVar89._20_4_ = uVar86;
                auVar89._24_4_ = uVar86;
                auVar89._28_4_ = uVar86;
                auVar69._8_8_ = local_2aa0._8_8_;
                auVar69._0_8_ = local_2aa0._0_8_;
                auVar69._16_8_ = local_2aa0._16_8_;
                auVar69._24_8_ = local_2aa0._24_8_;
                auVar70._8_8_ = local_2aa0._40_8_;
                auVar70._0_8_ = local_2aa0._32_8_;
                auVar70._16_8_ = local_2aa0._48_8_;
                auVar70._24_8_ = local_2aa0._56_8_;
                auVar71._8_8_ = local_2aa0._72_8_;
                auVar71._0_8_ = local_2aa0._64_8_;
                auVar71._16_8_ = local_2aa0._80_8_;
                auVar71._24_8_ = local_2aa0._88_8_;
                auVar99 = vsubps_avx(auVar89,auVar69);
                auVar122._0_4_ = (float)local_29e0._0_4_ * auVar99._0_4_;
                auVar122._4_4_ = (float)local_29e0._4_4_ * auVar99._4_4_;
                auVar122._8_4_ = fStack_29d8 * auVar99._8_4_;
                auVar122._12_4_ = fStack_29d4 * auVar99._12_4_;
                auVar122._16_4_ = fStack_29d0 * auVar99._16_4_;
                auVar122._20_4_ = fStack_29cc * auVar99._20_4_;
                auVar122._28_36_ = auVar165._28_36_;
                auVar122._24_4_ = fStack_29c8 * auVar99._24_4_;
                auVar116 = auVar122._0_32_;
                auVar165 = ZEXT3264(auVar116);
                uVar86 = *(undefined4 *)(root.ptr + 0x40 + lVar77 * 4);
                auVar90._4_4_ = uVar86;
                auVar90._0_4_ = uVar86;
                auVar90._8_4_ = uVar86;
                auVar90._12_4_ = uVar86;
                auVar90._16_4_ = uVar86;
                auVar90._20_4_ = uVar86;
                auVar90._24_4_ = uVar86;
                auVar90._28_4_ = uVar86;
                auVar99 = vsubps_avx(auVar90,auVar70);
                auVar189._0_4_ = (float)local_29c0._0_4_ * auVar99._0_4_;
                auVar189._4_4_ = (float)local_29c0._4_4_ * auVar99._4_4_;
                auVar189._8_4_ = fStack_29b8 * auVar99._8_4_;
                auVar189._12_4_ = fStack_29b4 * auVar99._12_4_;
                auVar189._16_4_ = fStack_29b0 * auVar99._16_4_;
                auVar189._20_4_ = fStack_29ac * auVar99._20_4_;
                auVar189._28_36_ = auVar171._28_36_;
                auVar189._24_4_ = fStack_29a8 * auVar99._24_4_;
                auVar115 = auVar189._0_32_;
                auVar171 = ZEXT3264(auVar115);
                uVar86 = *(undefined4 *)(root.ptr + 0x60 + lVar77 * 4);
                auVar91._4_4_ = uVar86;
                auVar91._0_4_ = uVar86;
                auVar91._8_4_ = uVar86;
                auVar91._12_4_ = uVar86;
                auVar91._16_4_ = uVar86;
                auVar91._20_4_ = uVar86;
                auVar91._24_4_ = uVar86;
                auVar91._28_4_ = uVar86;
                auVar99 = vsubps_avx(auVar91,auVar71);
                auVar141._0_4_ = (float)local_29a0._0_4_ * auVar99._0_4_;
                auVar141._4_4_ = (float)local_29a0._4_4_ * auVar99._4_4_;
                auVar141._8_4_ = fStack_2998 * auVar99._8_4_;
                auVar141._12_4_ = fStack_2994 * auVar99._12_4_;
                auVar141._16_4_ = fStack_2990 * auVar99._16_4_;
                auVar141._20_4_ = fStack_298c * auVar99._20_4_;
                auVar141._28_36_ = auVar181._28_36_;
                auVar141._24_4_ = fStack_2988 * auVar99._24_4_;
                auVar144 = auVar141._0_32_;
                auVar181 = ZEXT3264(auVar144);
                uVar86 = *(undefined4 *)(root.ptr + 0x30 + lVar77 * 4);
                auVar92._4_4_ = uVar86;
                auVar92._0_4_ = uVar86;
                auVar92._8_4_ = uVar86;
                auVar92._12_4_ = uVar86;
                auVar92._16_4_ = uVar86;
                auVar92._20_4_ = uVar86;
                auVar92._24_4_ = uVar86;
                auVar92._28_4_ = uVar86;
                auVar99 = vsubps_avx(auVar92,auVar69);
                auVar162._4_4_ = (float)local_29e0._4_4_ * auVar99._4_4_;
                auVar162._0_4_ = (float)local_29e0._0_4_ * auVar99._0_4_;
                auVar162._8_4_ = fStack_29d8 * auVar99._8_4_;
                auVar162._12_4_ = fStack_29d4 * auVar99._12_4_;
                auVar162._16_4_ = fStack_29d0 * auVar99._16_4_;
                auVar162._20_4_ = fStack_29cc * auVar99._20_4_;
                auVar162._24_4_ = fStack_29c8 * auVar99._24_4_;
                auVar162._28_4_ = (int)((ulong)local_2aa0._24_8_ >> 0x20);
                uVar86 = *(undefined4 *)(root.ptr + 0x50 + lVar77 * 4);
                auVar93._4_4_ = uVar86;
                auVar93._0_4_ = uVar86;
                auVar93._8_4_ = uVar86;
                auVar93._12_4_ = uVar86;
                auVar93._16_4_ = uVar86;
                auVar93._20_4_ = uVar86;
                auVar93._24_4_ = uVar86;
                auVar93._28_4_ = uVar86;
                auVar99 = vsubps_avx(auVar93,auVar70);
                auVar20._4_4_ = (float)local_29c0._4_4_ * auVar99._4_4_;
                auVar20._0_4_ = (float)local_29c0._0_4_ * auVar99._0_4_;
                auVar20._8_4_ = fStack_29b8 * auVar99._8_4_;
                auVar20._12_4_ = fStack_29b4 * auVar99._12_4_;
                auVar20._16_4_ = fStack_29b0 * auVar99._16_4_;
                auVar20._20_4_ = fStack_29ac * auVar99._20_4_;
                auVar20._24_4_ = fStack_29a8 * auVar99._24_4_;
                auVar20._28_4_ = (int)((ulong)local_2aa0._56_8_ >> 0x20);
                uVar86 = *(undefined4 *)(root.ptr + 0x70 + lVar77 * 4);
                auVar94._4_4_ = uVar86;
                auVar94._0_4_ = uVar86;
                auVar94._8_4_ = uVar86;
                auVar94._12_4_ = uVar86;
                auVar94._16_4_ = uVar86;
                auVar94._20_4_ = uVar86;
                auVar94._24_4_ = uVar86;
                auVar94._28_4_ = uVar86;
                auVar99 = vsubps_avx(auVar94,auVar71);
                auVar148._4_4_ = (float)local_29a0._4_4_ * auVar99._4_4_;
                auVar148._0_4_ = (float)local_29a0._0_4_ * auVar99._0_4_;
                auVar148._8_4_ = fStack_2998 * auVar99._8_4_;
                auVar148._12_4_ = fStack_2994 * auVar99._12_4_;
                auVar148._16_4_ = fStack_2990 * auVar99._16_4_;
                auVar148._20_4_ = fStack_298c * auVar99._20_4_;
                auVar148._24_4_ = fStack_2988 * auVar99._24_4_;
                auVar148._28_4_ = (int)((ulong)local_2aa0._88_8_ >> 0x20);
                auVar99 = vminps_avx(auVar116,auVar162);
                auVar149 = vminps_avx(auVar115,auVar20);
                auVar99 = vmaxps_avx(auVar99,auVar149);
                auVar149 = vminps_avx(auVar144,auVar148);
                auVar99 = vmaxps_avx(auVar99,auVar149);
                auVar160._4_4_ = auVar185._4_4_ * auVar99._4_4_;
                auVar160._0_4_ = auVar185._0_4_ * auVar99._0_4_;
                auVar160._8_4_ = auVar185._8_4_ * auVar99._8_4_;
                auVar160._12_4_ = auVar185._12_4_ * auVar99._12_4_;
                auVar160._16_4_ = auVar185._16_4_ * auVar99._16_4_;
                auVar160._20_4_ = auVar185._20_4_ * auVar99._20_4_;
                auVar160._24_4_ = auVar185._24_4_ * auVar99._24_4_;
                auVar160._28_4_ = auVar99._28_4_;
                auVar99 = vmaxps_avx(auVar116,auVar162);
                auVar149 = vmaxps_avx(auVar115,auVar20);
                auVar149 = vminps_avx(auVar99,auVar149);
                auVar99 = vmaxps_avx(auVar144,auVar148);
                auVar99 = vminps_avx(auVar149,auVar99);
                auVar21._4_4_ = auVar188._4_4_ * auVar99._4_4_;
                auVar21._0_4_ = auVar188._0_4_ * auVar99._0_4_;
                auVar21._8_4_ = auVar188._8_4_ * auVar99._8_4_;
                auVar21._12_4_ = auVar188._12_4_ * auVar99._12_4_;
                auVar21._16_4_ = auVar188._16_4_ * auVar99._16_4_;
                auVar21._20_4_ = auVar188._20_4_ * auVar99._20_4_;
                auVar21._24_4_ = auVar188._24_4_ * auVar99._24_4_;
                auVar21._28_4_ = auVar99._28_4_;
                auVar99 = vmaxps_avx(auVar160,local_2920);
                auVar149 = vminps_avx(auVar21,local_2900);
                auVar149 = vcmpps_avx(auVar99,auVar149,2);
                auVar122 = ZEXT3264(auVar149);
                uVar80 = uVar75;
                auVar99 = auVar154;
                if (((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar149 >> 0x7f,0) != '\0') ||
                       (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar149 >> 0xbf,0) != '\0') ||
                     (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar149[0x1f] < '\0') &&
                   (auVar99 = vblendvps_avx(auVar182._0_32_,auVar160,auVar149), uVar80 = uVar78,
                   uVar75 != 8)) {
                  *puVar88 = uVar75;
                  puVar88 = puVar88 + 1;
                  *pauVar79 = auVar154;
                  pauVar79 = pauVar79 + 1;
                }
                auVar154 = auVar99;
                uVar75 = uVar80;
              }
              if (uVar75 == 8) goto LAB_015ce439;
              auVar99 = vcmpps_avx(local_2900,auVar154,6);
              uVar86 = vmovmskps_avx(auVar99);
              root.ptr = uVar75;
            } while ((byte)uVar83 < (byte)POPCOUNT(uVar86));
            *puVar88 = uVar75;
            puVar88 = puVar88 + 1;
            *pauVar79 = auVar154;
            pauVar79 = pauVar79 + 1;
          }
          else {
            while (unaff_R13 != (Geometry *)0x0) {
              k = 0;
              for (pGVar76 = unaff_R13; ((ulong)pGVar76 & 1) == 0;
                  pGVar76 = (Geometry *)((ulong)pGVar76 >> 1 | 0x8000000000000000)) {
                k = k + 1;
              }
              unaff_R13 = (Geometry *)((ulong)&unaff_R13[-1].field_0x5f & (ulong)unaff_R13);
              local_2f60._0_8_ = k;
              auVar122 = ZEXT1664(auVar122._0_16_);
              auVar165 = ZEXT1664(auVar165._0_16_);
              auVar171 = ZEXT1664(auVar171._0_16_);
              auVar181 = ZEXT1664(auVar181._0_16_);
              bVar73 = occluded1(local_2dc8,local_2dd0,root,k,&local_2e70,ray,
                                 (TravRayK<8,_true> *)&local_2aa0.field_0,context);
              if (bVar73) {
                *(undefined4 *)(local_2d80 + local_2f60._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar154 = _DAT_01f7b020 & ~local_2d80;
            iVar74 = 3;
            auVar182 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar185 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar188 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar189 = ZEXT3264(local_2e60);
            if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar154 >> 0x7f,0) != '\0') ||
                  (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar154 >> 0xbf,0) != '\0') ||
                (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar154[0x1f] < '\0') {
              auVar122 = ZEXT3264(local_2900);
              auVar154._8_4_ = 0xff800000;
              auVar154._0_8_ = 0xff800000ff800000;
              auVar154._12_4_ = 0xff800000;
              auVar154._16_4_ = 0xff800000;
              auVar154._20_4_ = 0xff800000;
              auVar154._24_4_ = 0xff800000;
              auVar154._28_4_ = 0xff800000;
              local_2900 = vblendvps_avx(local_2900,auVar154,local_2d80);
              iVar74 = 2;
            }
            unaff_R13 = (Geometry *)0x0;
            if (uVar83 < (uint)POPCOUNT(uVar86)) goto LAB_015ce2ba;
          }
LAB_015ce439:
        } while ((iVar74 == 4) || (iVar74 == 2));
LAB_015cfa85:
        auVar154 = vandps_avx(local_28c0,local_2d80);
        auVar121._8_4_ = 0xff800000;
        auVar121._0_8_ = 0xff800000ff800000;
        auVar121._12_4_ = 0xff800000;
        auVar121._16_4_ = 0xff800000;
        auVar121._20_4_ = 0xff800000;
        auVar121._24_4_ = 0xff800000;
        auVar121._28_4_ = 0xff800000;
        auVar154 = vmaskmovps_avx(auVar154,auVar121);
        *(undefined1 (*) [32])local_2f30 = auVar154;
        return;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }